

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<8,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar83 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  int iVar101;
  undefined4 uVar102;
  vfloat4 a0;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  float t1;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  vfloat4 a0_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar118;
  float fVar126;
  float fVar127;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  vfloat4 b0;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  __m128 a_1;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vfloat4 b0_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  float fVar167;
  float fVar168;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar169;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  __m128 a;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar173 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar182 [16];
  undefined1 auVar191 [32];
  float fVar192;
  vfloat4 a0_2;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar210;
  float fVar211;
  vfloat4 a0_3;
  undefined1 auVar201 [16];
  float fVar212;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar225;
  vfloat4 b0_2;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  vfloat4 b0_3;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  uint auStack_630 [4];
  RTCFilterFunctionNArguments local_620;
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar25;
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  float fVar128;
  float fVar134;
  undefined1 auVar237 [32];
  
  uVar24 = (ulong)(byte)prim[1];
  lVar27 = uVar24 * 0x25;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar24 * 4 + 6);
  auVar79 = vpmovsxbd_avx2(auVar37);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar24 * 5 + 6);
  auVar76 = vpmovsxbd_avx2(auVar36);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar24 * 6 + 6);
  auVar82 = vpmovsxbd_avx2(auVar46);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar24 * 0xf + 6);
  auVar81 = vpmovsxbd_avx2(auVar45);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar80 = vpmovsxbd_avx2(auVar52);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar24 * 0x11 + 6);
  auVar77 = vpmovsxbd_avx2(auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar24 * 0x1a + 6);
  auVar78 = vpmovsxbd_avx2(auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar24 * 0x1b + 6);
  auVar71 = vpmovsxbd_avx2(auVar51);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar24 * 0x1c + 6);
  auVar72 = vpmovsxbd_avx2(auVar53);
  uVar102 = *(undefined4 *)(prim + lVar27 + 0x12);
  auVar54._4_4_ = uVar102;
  auVar54._0_4_ = uVar102;
  auVar54._8_4_ = uVar102;
  auVar54._12_4_ = uVar102;
  auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar36 = vsubps_avx512vl(auVar37,*(undefined1 (*) [16])(prim + lVar27 + 6));
  fVar200 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar27 + 0x16)) *
            *(float *)(prim + lVar27 + 0x1a);
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 * 7 + 6));
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 * 0xb + 6));
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 * 9 + 6));
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 * 0xd + 6));
  auVar99._32_32_ = vpbroadcastd_avx512vl();
  auVar63 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar24 * 0x12 + 6));
  auVar64 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar24 * 0x16 + 6));
  auVar65 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar24 * 0x14 + 6));
  auVar37 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar37 = vinsertps_avx512f(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar36 = vmulps_avx512vl(auVar54,auVar36);
  auVar37 = vmulps_avx512vl(auVar54,auVar37);
  auVar66 = vcvtdq2ps_avx512vl(auVar79);
  auVar67 = vcvtdq2ps_avx512vl(auVar76);
  auVar246 = ZEXT3264(auVar67);
  auVar68 = vcvtdq2ps_avx512vl(auVar82);
  auVar69 = vcvtdq2ps_avx512vl(auVar81);
  auVar70 = vcvtdq2ps_avx512vl(auVar80);
  auVar79 = vcvtdq2ps_avx(auVar77);
  auVar82 = vcvtdq2ps_avx(auVar78);
  auVar81 = vcvtdq2ps_avx(auVar71);
  auVar80 = vcvtdq2ps_avx(auVar72);
  uVar102 = auVar37._0_4_;
  auVar196._4_4_ = uVar102;
  auVar196._0_4_ = uVar102;
  auVar196._8_4_ = uVar102;
  auVar196._12_4_ = uVar102;
  auVar196._16_4_ = uVar102;
  auVar196._20_4_ = uVar102;
  auVar196._24_4_ = uVar102;
  auVar196._28_4_ = uVar102;
  auVar71 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar72 = vpermps_avx512vl(auVar71,ZEXT1632(auVar37));
  auVar73 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar74 = vpermps_avx512vl(auVar73,ZEXT1632(auVar37));
  auVar75 = vmulps_avx512vl(auVar74,auVar68);
  auVar77._4_4_ = auVar74._4_4_ * auVar79._4_4_;
  auVar77._0_4_ = auVar74._0_4_ * auVar79._0_4_;
  auVar77._8_4_ = auVar74._8_4_ * auVar79._8_4_;
  auVar77._12_4_ = auVar74._12_4_ * auVar79._12_4_;
  auVar77._16_4_ = auVar74._16_4_ * auVar79._16_4_;
  auVar77._20_4_ = auVar74._20_4_ * auVar79._20_4_;
  auVar77._24_4_ = auVar74._24_4_ * auVar79._24_4_;
  auVar77._28_4_ = auVar76._28_4_;
  auVar78._4_4_ = auVar80._4_4_ * auVar74._4_4_;
  auVar78._0_4_ = auVar80._0_4_ * auVar74._0_4_;
  auVar78._8_4_ = auVar80._8_4_ * auVar74._8_4_;
  auVar78._12_4_ = auVar80._12_4_ * auVar74._12_4_;
  auVar78._16_4_ = auVar80._16_4_ * auVar74._16_4_;
  auVar78._20_4_ = auVar80._20_4_ * auVar74._20_4_;
  auVar78._24_4_ = auVar80._24_4_ * auVar74._24_4_;
  auVar78._28_4_ = auVar74._28_4_;
  auVar76 = vfmadd231ps_avx512vl(auVar75,auVar72,auVar67);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar72,auVar70);
  auVar37 = vfmadd231ps_fma(auVar78,auVar81,auVar72);
  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar196,auVar66);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar196,auVar69);
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar82,auVar196);
  auVar78 = vbroadcastss_avx512vl(auVar36);
  auVar71 = vpermps_avx512vl(auVar71,ZEXT1632(auVar36));
  auVar72 = vpermps_avx512vl(auVar73,ZEXT1632(auVar36));
  auVar68 = vmulps_avx512vl(auVar72,auVar68);
  auVar79 = vmulps_avx512vl(auVar72,auVar79);
  auVar80 = vmulps_avx512vl(auVar72,auVar80);
  auVar72 = vfmadd231ps_avx512vl(auVar68,auVar71,auVar67);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar71,auVar70);
  auVar36 = vfmadd231ps_fma(auVar80,auVar71,auVar81);
  auVar81 = vfmadd231ps_avx512vl(auVar72,auVar78,auVar66);
  auVar80 = vfmadd231ps_avx512vl(auVar79,auVar78,auVar69);
  auVar54 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar78,auVar82);
  auVar69._8_4_ = 0x7fffffff;
  auVar69._0_8_ = 0x7fffffff7fffffff;
  auVar69._12_4_ = 0x7fffffff;
  auVar69._16_4_ = 0x7fffffff;
  auVar69._20_4_ = 0x7fffffff;
  auVar69._24_4_ = 0x7fffffff;
  auVar69._28_4_ = 0x7fffffff;
  auVar79 = vandps_avx(auVar69,auVar76);
  auVar73._8_4_ = 0x219392ef;
  auVar73._0_8_ = 0x219392ef219392ef;
  auVar73._12_4_ = 0x219392ef;
  auVar73._16_4_ = 0x219392ef;
  auVar73._20_4_ = 0x219392ef;
  auVar73._24_4_ = 0x219392ef;
  auVar73._28_4_ = 0x219392ef;
  uVar30 = vcmpps_avx512vl(auVar79,auVar73,1);
  bVar31 = (bool)((byte)uVar30 & 1);
  auVar66._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar76._0_4_;
  bVar31 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar76._4_4_;
  bVar31 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar76._8_4_;
  bVar31 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar76._12_4_;
  bVar31 = (bool)((byte)(uVar30 >> 4) & 1);
  auVar66._16_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar76._16_4_;
  bVar31 = (bool)((byte)(uVar30 >> 5) & 1);
  auVar66._20_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar76._20_4_;
  bVar31 = (bool)((byte)(uVar30 >> 6) & 1);
  auVar66._24_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar76._24_4_;
  bVar31 = SUB81(uVar30 >> 7,0);
  auVar66._28_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar76._28_4_;
  auVar79 = vandps_avx(auVar69,auVar77);
  uVar30 = vcmpps_avx512vl(auVar79,auVar73,1);
  bVar31 = (bool)((byte)uVar30 & 1);
  auVar67._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar77._0_4_;
  bVar31 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar77._4_4_;
  bVar31 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar77._8_4_;
  bVar31 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar77._12_4_;
  bVar31 = (bool)((byte)(uVar30 >> 4) & 1);
  auVar67._16_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar77._16_4_;
  bVar31 = (bool)((byte)(uVar30 >> 5) & 1);
  auVar67._20_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar77._20_4_;
  bVar31 = (bool)((byte)(uVar30 >> 6) & 1);
  auVar67._24_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar77._24_4_;
  bVar31 = SUB81(uVar30 >> 7,0);
  auVar67._28_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar77._28_4_;
  auVar79 = vandps_avx(auVar69,ZEXT1632(auVar37));
  uVar30 = vcmpps_avx512vl(auVar79,auVar73,1);
  bVar31 = (bool)((byte)uVar30 & 1);
  auVar79._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._0_4_;
  bVar31 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._4_4_;
  bVar31 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._8_4_;
  bVar31 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar30 >> 7) * 0x219392ef;
  auVar82 = vrcp14ps_avx512vl(auVar66);
  auVar70._8_4_ = 0x3f800000;
  auVar70._0_8_ = 0x3f8000003f800000;
  auVar70._12_4_ = 0x3f800000;
  auVar70._16_4_ = 0x3f800000;
  auVar70._20_4_ = 0x3f800000;
  auVar70._24_4_ = 0x3f800000;
  auVar70._28_4_ = 0x3f800000;
  auVar37 = vfnmadd213ps_fma(auVar66,auVar82,auVar70);
  auVar37 = vfmadd132ps_fma(ZEXT1632(auVar37),auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar67);
  auVar36 = vfnmadd213ps_fma(auVar67,auVar82,auVar70);
  auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar79);
  auVar46 = vfnmadd213ps_fma(auVar79,auVar82,auVar70);
  auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar82,auVar82);
  auVar68._4_4_ = fVar200;
  auVar68._0_4_ = fVar200;
  auVar68._8_4_ = fVar200;
  auVar68._12_4_ = fVar200;
  auVar68._16_4_ = fVar200;
  auVar68._20_4_ = fVar200;
  auVar68._24_4_ = fVar200;
  auVar68._28_4_ = fVar200;
  auVar79 = vcvtdq2ps_avx(auVar83);
  auVar82 = vcvtdq2ps_avx(auVar84);
  auVar82 = vsubps_avx(auVar82,auVar79);
  auVar45 = vfmadd213ps_fma(auVar82,auVar68,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar85);
  auVar82 = vcvtdq2ps_avx(auVar86);
  auVar82 = vsubps_avx(auVar82,auVar79);
  auVar52 = vfmadd213ps_fma(auVar82,auVar68,auVar79);
  auVar82 = vcvtdq2ps_avx512vl(auVar63);
  auVar79 = vcvtdq2ps_avx512vl(auVar64);
  auVar79 = vsubps_avx(auVar79,auVar82);
  auVar49 = vfmadd213ps_fma(auVar79,auVar68,auVar82);
  auVar76 = vcvtdq2ps_avx512vl(auVar65);
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 * 0x18 + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar76);
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 * 0x1d + 6));
  auVar50 = vfmadd213ps_fma(auVar79,auVar68,auVar76);
  auVar79 = vcvtdq2ps_avx(auVar82);
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 * 0x21 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar79);
  auVar51 = vfmadd213ps_fma(auVar82,auVar68,auVar79);
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 * 0x1f + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 * 0x23 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar79);
  auVar53 = vfmadd213ps_fma(auVar82,auVar68,auVar79);
  auVar79 = vsubps_avx512vl(ZEXT1632(auVar45),auVar81);
  auVar71._4_4_ = auVar37._4_4_ * auVar79._4_4_;
  auVar71._0_4_ = auVar37._0_4_ * auVar79._0_4_;
  auVar71._8_4_ = auVar37._8_4_ * auVar79._8_4_;
  auVar71._12_4_ = auVar37._12_4_ * auVar79._12_4_;
  auVar71._16_4_ = auVar79._16_4_ * 0.0;
  auVar71._20_4_ = auVar79._20_4_ * 0.0;
  auVar71._24_4_ = auVar79._24_4_ * 0.0;
  auVar71._28_4_ = auVar79._28_4_;
  auVar79 = vsubps_avx512vl(ZEXT1632(auVar52),auVar81);
  auVar86._0_4_ = auVar37._0_4_ * auVar79._0_4_;
  auVar86._4_4_ = auVar37._4_4_ * auVar79._4_4_;
  auVar86._8_4_ = auVar37._8_4_ * auVar79._8_4_;
  auVar86._12_4_ = auVar37._12_4_ * auVar79._12_4_;
  auVar86._16_4_ = auVar79._16_4_ * 0.0;
  auVar86._20_4_ = auVar79._20_4_ * 0.0;
  auVar86._24_4_ = auVar79._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar79 = vsubps_avx(ZEXT1632(auVar49),auVar80);
  auVar72._4_4_ = auVar36._4_4_ * auVar79._4_4_;
  auVar72._0_4_ = auVar36._0_4_ * auVar79._0_4_;
  auVar72._8_4_ = auVar36._8_4_ * auVar79._8_4_;
  auVar72._12_4_ = auVar36._12_4_ * auVar79._12_4_;
  auVar72._16_4_ = auVar79._16_4_ * 0.0;
  auVar72._20_4_ = auVar79._20_4_ * 0.0;
  auVar72._24_4_ = auVar79._24_4_ * 0.0;
  auVar72._28_4_ = auVar79._28_4_;
  auVar79 = vsubps_avx(ZEXT1632(auVar50),auVar80);
  auVar85._0_4_ = auVar36._0_4_ * auVar79._0_4_;
  auVar85._4_4_ = auVar36._4_4_ * auVar79._4_4_;
  auVar85._8_4_ = auVar36._8_4_ * auVar79._8_4_;
  auVar85._12_4_ = auVar36._12_4_ * auVar79._12_4_;
  auVar85._16_4_ = auVar79._16_4_ * 0.0;
  auVar85._20_4_ = auVar79._20_4_ * 0.0;
  auVar85._24_4_ = auVar79._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar79 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar54));
  auVar83._4_4_ = auVar46._4_4_ * auVar79._4_4_;
  auVar83._0_4_ = auVar46._0_4_ * auVar79._0_4_;
  auVar83._8_4_ = auVar46._8_4_ * auVar79._8_4_;
  auVar83._12_4_ = auVar46._12_4_ * auVar79._12_4_;
  auVar83._16_4_ = auVar79._16_4_ * 0.0;
  auVar83._20_4_ = auVar79._20_4_ * 0.0;
  auVar83._24_4_ = auVar79._24_4_ * 0.0;
  auVar83._28_4_ = auVar79._28_4_;
  auVar79 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar54));
  auVar84._0_4_ = auVar46._0_4_ * auVar79._0_4_;
  auVar84._4_4_ = auVar46._4_4_ * auVar79._4_4_;
  auVar84._8_4_ = auVar46._8_4_ * auVar79._8_4_;
  auVar84._12_4_ = auVar46._12_4_ * auVar79._12_4_;
  auVar84._16_4_ = auVar79._16_4_ * 0.0;
  auVar84._20_4_ = auVar79._20_4_ * 0.0;
  auVar84._24_4_ = auVar79._24_4_ * 0.0;
  auVar84._28_4_ = 0;
  auVar79 = vpminsd_avx2(auVar71,auVar86);
  auVar82 = vpminsd_avx2(auVar72,auVar85);
  auVar79 = vmaxps_avx(auVar79,auVar82);
  auVar82 = vpminsd_avx2(auVar83,auVar84);
  uVar102 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar81._4_4_ = uVar102;
  auVar81._0_4_ = uVar102;
  auVar81._8_4_ = uVar102;
  auVar81._12_4_ = uVar102;
  auVar81._16_4_ = uVar102;
  auVar81._20_4_ = uVar102;
  auVar81._24_4_ = uVar102;
  auVar81._28_4_ = uVar102;
  auVar82 = vmaxps_avx512vl(auVar82,auVar81);
  auVar79 = vmaxps_avx(auVar79,auVar82);
  auVar82._8_4_ = 0x3f7ffffa;
  auVar82._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar82._12_4_ = 0x3f7ffffa;
  auVar82._16_4_ = 0x3f7ffffa;
  auVar82._20_4_ = 0x3f7ffffa;
  auVar82._24_4_ = 0x3f7ffffa;
  auVar82._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar79,auVar82);
  auVar79 = vpmaxsd_avx2(auVar71,auVar86);
  auVar82 = vpmaxsd_avx2(auVar72,auVar85);
  auVar79 = vminps_avx(auVar79,auVar82);
  auVar82 = vpmaxsd_avx2(auVar83,auVar84);
  uVar102 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar80._4_4_ = uVar102;
  auVar80._0_4_ = uVar102;
  auVar80._8_4_ = uVar102;
  auVar80._12_4_ = uVar102;
  auVar80._16_4_ = uVar102;
  auVar80._20_4_ = uVar102;
  auVar80._24_4_ = uVar102;
  auVar80._28_4_ = uVar102;
  auVar82 = vminps_avx512vl(auVar82,auVar80);
  auVar79 = vminps_avx(auVar79,auVar82);
  auVar76._8_4_ = 0x3f800003;
  auVar76._0_8_ = 0x3f8000033f800003;
  auVar76._12_4_ = 0x3f800003;
  auVar76._16_4_ = 0x3f800003;
  auVar76._20_4_ = 0x3f800003;
  auVar76._24_4_ = 0x3f800003;
  auVar76._28_4_ = 0x3f800003;
  auVar79 = vmulps_avx512vl(auVar79,auVar76);
  uVar15 = vcmpps_avx512vl(local_3c0,auVar79,2);
  uVar16 = vpcmpgtd_avx512vl(auVar99._32_32_,_DAT_01fb4ba0);
  uVar30 = CONCAT44((int)((ulong)prim >> 0x20),(uint)(byte)((byte)uVar15 & (byte)uVar16));
  auVar107 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar107);
  auVar37 = vpxord_avx512vl(auVar64._0_16_,auVar64._0_16_);
  auVar107 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar253 = ZEXT1664(auVar37);
LAB_01b56e53:
  if (uVar30 == 0) {
LAB_01b58dee:
    return uVar30 != 0;
  }
  lVar27 = 0;
  for (uVar24 = uVar30; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
    lVar27 = lVar27 + 1;
  }
  uVar7 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar7].ptr;
  fVar200 = (pGVar9->time_range).lower;
  fVar200 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar200) / ((pGVar9->time_range).upper - fVar200));
  auVar37 = vroundss_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),9);
  auVar36 = vaddss_avx512f(ZEXT416((uint)pGVar9->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar37 = vminss_avx(auVar37,auVar36);
  auVar38 = vmaxss_avx512f(auVar107._0_16_,auVar37);
  uVar24 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)*(uint *)(prim + lVar27 * 4 + 6) *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar29 = (long)(int)auVar38._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar29);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar29);
  auVar37 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar24);
  lVar27 = uVar24 + 1;
  auVar36 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar27);
  lVar1 = uVar24 + 2;
  auVar46 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar2 = uVar24 + 3;
  auVar45 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar29);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar29);
  auVar52 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar24);
  auVar49 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar27);
  auVar50 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar51 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar29);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar29);
  auVar53 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar24);
  auVar54 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar27);
  auVar55 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar56 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  auVar107 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar107);
  lVar12 = *(long *)(lVar11 + 0x38 + lVar29);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar29);
  auVar57 = *(undefined1 (*) [16])(lVar12 + uVar24 * lVar11);
  auVar58 = *(undefined1 (*) [16])(lVar12 + lVar27 * lVar11);
  auVar109 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar11);
  auVar38 = vsubss_avx512f(ZEXT416((uint)fVar200),auVar38);
  auVar107._0_16_ = vxorps_avx512vl(auVar246._0_16_,auVar246._0_16_);
  auVar39 = vmulps_avx512vl(auVar45,auVar107._0_16_);
  auVar108._8_4_ = 0x3e2aaaab;
  auVar108._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar108._12_4_ = 0x3e2aaaab;
  auVar40 = vfmadd213ps_avx512vl(auVar108,auVar46,auVar39);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar36,auVar41);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar37,auVar108);
  auVar59 = auVar253._0_16_;
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar46,auVar59);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar36,auVar107._0_16_);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar37,auVar59);
  auVar42 = vmulps_avx512vl(auVar51,auVar107._0_16_);
  auVar43 = vfmadd213ps_avx512vl(auVar108,auVar50,auVar42);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar49,auVar41);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar52,auVar108);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar50,auVar59);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar49,auVar107._0_16_);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar52,auVar59);
  auVar44 = vmulps_avx512vl(auVar45,auVar108);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar46,auVar41);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar36,auVar108);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar37,auVar107._0_16_);
  auVar45 = vmulps_avx512vl(auVar45,auVar59);
  auVar46 = vfmadd231ps_avx512vl(auVar45,auVar107._0_16_,auVar46);
  auVar36 = vfnmadd231ps_avx512vl(auVar46,auVar59,auVar36);
  auVar47 = vfnmadd231ps_avx512vl(auVar36,auVar107._0_16_,auVar37);
  auVar48._0_4_ = auVar51._0_4_ * 0.16666667;
  auVar48._4_4_ = auVar51._4_4_ * 0.16666667;
  auVar48._8_4_ = auVar51._8_4_ * 0.16666667;
  auVar48._12_4_ = auVar51._12_4_ * 0.16666667;
  auVar37 = vfmadd231ps_avx512vl(auVar48,auVar50,auVar41);
  auVar37 = vfmadd231ps_fma(auVar37,auVar49,auVar108);
  auVar48 = vfmadd231ps_avx512vl(auVar37,auVar52,auVar107._0_16_);
  auVar37 = vmulps_avx512vl(auVar51,auVar59);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar107._0_16_,auVar50);
  auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar59,auVar49);
  auVar49 = vfnmadd231ps_avx512vl(auVar37,auVar107._0_16_,auVar52);
  auVar37 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar36 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  fVar118 = auVar39._0_4_;
  auVar135._0_4_ = fVar118 * auVar36._0_4_;
  fVar126 = auVar39._4_4_;
  auVar135._4_4_ = fVar126 * auVar36._4_4_;
  fVar127 = auVar39._8_4_;
  auVar135._8_4_ = fVar127 * auVar36._8_4_;
  fVar212 = auVar39._12_4_;
  auVar135._12_4_ = fVar212 * auVar36._12_4_;
  auVar36 = vfmsub231ps_avx512vl(auVar135,auVar37,auVar43);
  auVar46 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx512vl(auVar42,auVar42,0xc9);
  auVar148._0_4_ = fVar118 * auVar36._0_4_;
  auVar148._4_4_ = fVar126 * auVar36._4_4_;
  auVar148._8_4_ = fVar127 * auVar36._8_4_;
  auVar148._12_4_ = fVar212 * auVar36._12_4_;
  auVar37 = vfmsub231ps_avx512vl(auVar148,auVar37,auVar42);
  auVar45 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar36 = vshufps_avx(auVar48,auVar48,0xc9);
  fVar215 = auVar47._0_4_;
  auVar170._0_4_ = auVar36._0_4_ * fVar215;
  fVar210 = auVar47._4_4_;
  auVar170._4_4_ = auVar36._4_4_ * fVar210;
  fVar211 = auVar47._8_4_;
  auVar170._8_4_ = auVar36._8_4_ * fVar211;
  fVar128 = auVar47._12_4_;
  auVar170._12_4_ = auVar36._12_4_ * fVar128;
  auVar36 = vfmsub231ps_fma(auVar170,auVar37,auVar48);
  auVar52 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar171._0_4_ = auVar36._0_4_ * fVar215;
  auVar171._4_4_ = auVar36._4_4_ * fVar210;
  auVar171._8_4_ = auVar36._8_4_ * fVar211;
  auVar171._12_4_ = auVar36._12_4_ * fVar128;
  auVar37 = vfmsub231ps_fma(auVar171,auVar37,auVar49);
  auVar49 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vdpps_avx(auVar46,auVar46,0x7f);
  auVar246._4_60_ = auVar107._4_60_;
  auVar246._0_4_ = auVar37._0_4_;
  auVar36 = vrsqrt14ss_avx512f(auVar107._0_16_,auVar246._0_16_);
  auVar50 = vmulss_avx512f(auVar36,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar37,ZEXT416(0xbf000000));
  auVar51 = vmulss_avx512f(auVar51,auVar36);
  auVar36 = vmulss_avx512f(auVar51,ZEXT416((uint)(auVar36._0_4_ * auVar36._0_4_)));
  auVar36 = vaddss_avx512f(auVar50,auVar36);
  auVar179._0_4_ = auVar36._0_4_;
  auVar179._4_4_ = auVar179._0_4_;
  auVar179._8_4_ = auVar179._0_4_;
  auVar179._12_4_ = auVar179._0_4_;
  auVar50 = vmulps_avx512vl(auVar46,auVar179);
  auVar36 = vdpps_avx(auVar46,auVar45,0x7f);
  auVar51 = vbroadcastss_avx512vl(auVar37);
  auVar45 = vmulps_avx512vl(auVar51,auVar45);
  fVar200 = auVar36._0_4_;
  auVar136._0_4_ = fVar200 * auVar46._0_4_;
  auVar136._4_4_ = fVar200 * auVar46._4_4_;
  auVar136._8_4_ = fVar200 * auVar46._8_4_;
  auVar136._12_4_ = fVar200 * auVar46._12_4_;
  auVar46 = vsubps_avx(auVar45,auVar136);
  auVar36 = vrcp14ss_avx512f(auVar107._0_16_,auVar246._0_16_);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar36,ZEXT416(0x40000000));
  fVar134 = auVar36._0_4_ * auVar37._0_4_;
  auVar37 = vdpps_avx(auVar52,auVar52,0x7f);
  auVar253._16_48_ = auVar107._16_48_;
  auVar253._0_16_ = auVar107._0_16_;
  auVar250._4_60_ = auVar253._4_60_;
  auVar250._0_4_ = auVar37._0_4_;
  auVar36 = vrsqrt14ss_avx512f(auVar107._0_16_,auVar250._0_16_);
  auVar45 = vmulss_avx512f(auVar36,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar37,ZEXT416(0xbf000000));
  fVar200 = auVar36._0_4_;
  fVar200 = auVar45._0_4_ + auVar51._0_4_ * fVar200 * fVar200 * fVar200;
  auVar180._0_4_ = fVar200 * auVar52._0_4_;
  auVar180._4_4_ = fVar200 * auVar52._4_4_;
  auVar180._8_4_ = fVar200 * auVar52._8_4_;
  auVar180._12_4_ = fVar200 * auVar52._12_4_;
  auVar36 = vdpps_avx(auVar52,auVar49,0x7f);
  auVar45 = vbroadcastss_avx512vl(auVar37);
  auVar45 = vmulps_avx512vl(auVar45,auVar49);
  fVar192 = auVar36._0_4_;
  auVar42._0_4_ = fVar192 * auVar52._0_4_;
  auVar42._4_4_ = fVar192 * auVar52._4_4_;
  auVar42._8_4_ = fVar192 * auVar52._8_4_;
  auVar42._12_4_ = fVar192 * auVar52._12_4_;
  auVar36 = vsubps_avx(auVar45,auVar42);
  auVar45 = vrcp14ss_avx512f(auVar107._0_16_,auVar250._0_16_);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar45,ZEXT416(0x40000000));
  fVar192 = auVar45._0_4_ * auVar37._0_4_;
  auVar45 = vshufps_avx512vl(auVar40,auVar40,0xff);
  auVar52 = vmulps_avx512vl(auVar45,auVar50);
  auVar49 = vsubps_avx512vl(auVar40,auVar52);
  auVar37 = vshufps_avx(auVar39,auVar39,0xff);
  auVar37 = vmulps_avx512vl(auVar37,auVar50);
  auVar129._0_4_ = auVar37._0_4_ + auVar45._0_4_ * auVar179._0_4_ * fVar134 * auVar46._0_4_;
  auVar129._4_4_ = auVar37._4_4_ + auVar45._4_4_ * auVar179._0_4_ * fVar134 * auVar46._4_4_;
  auVar129._8_4_ = auVar37._8_4_ + auVar45._8_4_ * auVar179._0_4_ * fVar134 * auVar46._8_4_;
  auVar129._12_4_ = auVar37._12_4_ + auVar45._12_4_ * auVar179._0_4_ * fVar134 * auVar46._12_4_;
  auVar37 = vsubps_avx(auVar39,auVar129);
  auVar50 = vaddps_avx512vl(auVar40,auVar52);
  auVar149._0_4_ = fVar118 + auVar129._0_4_;
  auVar149._4_4_ = fVar126 + auVar129._4_4_;
  auVar149._8_4_ = fVar127 + auVar129._8_4_;
  auVar149._12_4_ = fVar212 + auVar129._12_4_;
  auVar46 = vshufps_avx512vl(auVar44,auVar44,0xff);
  auVar226._0_4_ = auVar180._0_4_ * auVar46._0_4_;
  auVar226._4_4_ = auVar180._4_4_ * auVar46._4_4_;
  auVar226._8_4_ = auVar180._8_4_ * auVar46._8_4_;
  auVar226._12_4_ = auVar180._12_4_ * auVar46._12_4_;
  auVar51 = vsubps_avx512vl(auVar44,auVar226);
  auVar45 = vshufps_avx512vl(auVar47,auVar47,0xff);
  auVar45 = vmulps_avx512vl(auVar45,auVar180);
  auVar40._0_4_ = auVar45._0_4_ + auVar46._0_4_ * fVar200 * auVar36._0_4_ * fVar192;
  auVar40._4_4_ = auVar45._4_4_ + auVar46._4_4_ * fVar200 * auVar36._4_4_ * fVar192;
  auVar40._8_4_ = auVar45._8_4_ + auVar46._8_4_ * fVar200 * auVar36._8_4_ * fVar192;
  auVar40._12_4_ = auVar45._12_4_ + auVar46._12_4_ * fVar200 * auVar36._12_4_ * fVar192;
  auVar36 = vsubps_avx(auVar47,auVar40);
  auVar39 = vaddps_avx512vl(auVar44,auVar226);
  auVar227._0_4_ = fVar215 + auVar40._0_4_;
  auVar227._4_4_ = fVar210 + auVar40._4_4_;
  auVar227._8_4_ = fVar211 + auVar40._8_4_;
  auVar227._12_4_ = fVar128 + auVar40._12_4_;
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar37 = vmulps_avx512vl(auVar37,auVar40);
  auVar159._0_4_ = auVar49._0_4_ + auVar37._0_4_;
  auVar159._4_4_ = auVar49._4_4_ + auVar37._4_4_;
  auVar159._8_4_ = auVar49._8_4_ + auVar37._8_4_;
  auVar159._12_4_ = auVar49._12_4_ + auVar37._12_4_;
  auVar37 = vmulps_avx512vl(auVar36,auVar40);
  auVar52 = vsubps_avx(auVar51,auVar37);
  auVar37 = vmulps_avx512vl(auVar149,auVar40);
  auVar42 = vaddps_avx512vl(auVar50,auVar37);
  auVar37 = vmulps_avx512vl(auVar227,auVar40);
  auVar43 = vsubps_avx512vl(auVar39,auVar37);
  auVar37 = *(undefined1 (*) [16])(lVar12 + lVar11 * lVar2);
  auVar36 = vmulps_avx512vl(auVar56,auVar107._0_16_);
  auVar46 = vfmadd213ps_avx512vl(auVar108,auVar55,auVar36);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar54,auVar41);
  auVar44 = vfmadd231ps_avx512vl(auVar46,auVar53,auVar108);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar55,auVar59);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar54,auVar107._0_16_);
  auVar47 = vfnmadd231ps_avx512vl(auVar36,auVar53,auVar59);
  auVar36 = vmulps_avx512vl(auVar37,auVar107._0_16_);
  auVar46 = vfmadd213ps_avx512vl(auVar108,auVar109,auVar36);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar58,auVar41);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar57,auVar108);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar109,auVar59);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar58,auVar107._0_16_);
  auVar45 = vfnmadd231ps_avx512vl(auVar36,auVar57,auVar59);
  auVar36 = vmulps_avx512vl(auVar56,auVar108);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar55,auVar41);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar54,auVar108);
  auVar48 = vfmadd231ps_avx512vl(auVar36,auVar53,auVar107._0_16_);
  auVar36 = vmulps_avx512vl(auVar56,auVar59);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar107._0_16_,auVar55);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar59,auVar54);
  auVar53 = vfnmadd231ps_avx512vl(auVar36,auVar107._0_16_,auVar53);
  auVar36 = vmulps_avx512vl(auVar37,auVar108);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar109,auVar41);
  auVar36 = vfmadd231ps_fma(auVar36,auVar58,auVar108);
  auVar54 = vfmadd231ps_avx512vl(auVar36,auVar57,auVar107._0_16_);
  auVar37 = vmulps_avx512vl(auVar37,auVar59);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar107._0_16_,auVar109);
  auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar59,auVar58);
  auVar55 = vfnmadd231ps_avx512vl(auVar37,auVar107._0_16_,auVar57);
  auVar37 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar36 = vshufps_avx512vl(auVar46,auVar46,0xc9);
  fVar210 = auVar47._0_4_;
  auVar232._0_4_ = fVar210 * auVar36._0_4_;
  fVar211 = auVar47._4_4_;
  auVar232._4_4_ = fVar211 * auVar36._4_4_;
  fVar128 = auVar47._8_4_;
  auVar232._8_4_ = fVar128 * auVar36._8_4_;
  fVar134 = auVar47._12_4_;
  auVar232._12_4_ = fVar134 * auVar36._12_4_;
  auVar36 = vfmsub231ps_avx512vl(auVar232,auVar37,auVar46);
  auVar46 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  auVar238._0_4_ = fVar210 * auVar36._0_4_;
  auVar238._4_4_ = fVar211 * auVar36._4_4_;
  auVar238._8_4_ = fVar128 * auVar36._8_4_;
  auVar238._12_4_ = fVar134 * auVar36._12_4_;
  auVar37 = vfmsub231ps_avx512vl(auVar238,auVar37,auVar45);
  auVar45 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar36 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar37 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  auVar37 = vmulps_avx512vl(auVar53,auVar37);
  auVar37 = vfmsub231ps_avx512vl(auVar37,auVar36,auVar54);
  auVar54 = vshufps_avx512vl(auVar37,auVar37,0xc9);
  auVar56 = vshufps_avx512vl(auVar55,auVar55,0xc9);
  auVar37 = vdpps_avx(auVar46,auVar46,0x7f);
  auVar56 = vmulps_avx512vl(auVar53,auVar56);
  auVar36 = vfmsub231ps_avx512vl(auVar56,auVar36,auVar55);
  auVar55 = vshufps_avx512vl(auVar36,auVar36,0xc9);
  auVar252._16_48_ = auVar107._16_48_;
  auVar252._0_16_ = auVar107._0_16_;
  auVar251._4_60_ = auVar252._4_60_;
  auVar251._0_4_ = auVar37._0_4_;
  auVar36 = vrsqrt14ss_avx512f(auVar107._0_16_,auVar251._0_16_);
  auVar56 = vmulss_avx512f(auVar36,ZEXT416(0x3fc00000));
  auVar57 = vmulss_avx512f(auVar37,ZEXT416(0xbf000000));
  auVar57 = vmulss_avx512f(auVar57,auVar36);
  auVar36 = vmulss_avx512f(auVar36,auVar36);
  auVar36 = vmulss_avx512f(auVar57,auVar36);
  auVar36 = vaddss_avx512f(auVar56,auVar36);
  auVar56 = vbroadcastss_avx512vl(auVar36);
  auVar57 = vmulps_avx512vl(auVar46,auVar56);
  auVar36 = vdpps_avx(auVar46,auVar45,0x7f);
  auVar58 = vbroadcastss_avx512vl(auVar37);
  auVar45 = vmulps_avx512vl(auVar58,auVar45);
  fVar200 = auVar36._0_4_;
  auVar41._0_4_ = auVar46._0_4_ * fVar200;
  auVar41._4_4_ = auVar46._4_4_ * fVar200;
  auVar41._8_4_ = auVar46._8_4_ * fVar200;
  auVar41._12_4_ = auVar46._12_4_ * fVar200;
  auVar36 = vsubps_avx(auVar45,auVar41);
  auVar46 = vrcp14ss_avx512f(auVar107._0_16_,auVar251._0_16_);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar46,ZEXT416(0x40000000));
  fVar200 = auVar46._0_4_ * auVar37._0_4_;
  auVar37 = vdpps_avx(auVar54,auVar54,0x7f);
  auVar58._0_4_ = fVar200 * auVar36._0_4_;
  auVar58._4_4_ = fVar200 * auVar36._4_4_;
  auVar58._8_4_ = fVar200 * auVar36._8_4_;
  auVar58._12_4_ = fVar200 * auVar36._12_4_;
  auVar46 = vmulps_avx512vl(auVar56,auVar58);
  auVar247._16_48_ = auVar107._16_48_;
  auVar247._0_16_ = auVar107._0_16_;
  auVar248._4_60_ = auVar247._4_60_;
  auVar248._0_4_ = auVar37._0_4_;
  auVar36 = vrsqrt14ss_avx512f(auVar107._0_16_,auVar248._0_16_);
  auVar45 = vmulss_avx512f(auVar36,ZEXT416(0x3fc00000));
  auVar56 = vmulss_avx512f(auVar37,ZEXT416(0xbf000000));
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar252 = ZEXT1664(auVar41);
  auVar56 = vmulss_avx512f(auVar56,auVar36);
  auVar36 = vmulss_avx512f(auVar56,ZEXT416((uint)(auVar36._0_4_ * auVar36._0_4_)));
  fVar200 = auVar45._0_4_ + auVar36._0_4_;
  auVar239._0_4_ = auVar54._0_4_ * fVar200;
  auVar239._4_4_ = auVar54._4_4_ * fVar200;
  auVar239._8_4_ = auVar54._8_4_ * fVar200;
  auVar239._12_4_ = auVar54._12_4_ * fVar200;
  auVar36 = vdpps_avx(auVar54,auVar55,0x7f);
  auVar45 = vbroadcastss_avx512vl(auVar37);
  auVar45 = vmulps_avx512vl(auVar45,auVar55);
  fVar215 = auVar36._0_4_;
  auVar150._0_4_ = auVar54._0_4_ * fVar215;
  auVar150._4_4_ = auVar54._4_4_ * fVar215;
  auVar150._8_4_ = auVar54._8_4_ * fVar215;
  auVar150._12_4_ = auVar54._12_4_ * fVar215;
  auVar36 = vsubps_avx(auVar45,auVar150);
  auVar45 = vrcp14ss_avx512f(auVar107._0_16_,auVar248._0_16_);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar45,ZEXT416(0x40000000));
  auVar250 = ZEXT464(0x3f800000);
  fVar215 = auVar37._0_4_ * auVar45._0_4_;
  auVar45 = vshufps_avx512vl(auVar44,auVar44,0xff);
  auVar54 = vmulps_avx512vl(auVar45,auVar57);
  auVar55 = vsubps_avx512vl(auVar44,auVar54);
  auVar37 = vshufps_avx(auVar47,auVar47,0xff);
  auVar37 = vmulps_avx512vl(auVar37,auVar57);
  auVar57._0_4_ = auVar37._0_4_ + auVar45._0_4_ * auVar46._0_4_;
  auVar57._4_4_ = auVar37._4_4_ + auVar45._4_4_ * auVar46._4_4_;
  auVar57._8_4_ = auVar37._8_4_ + auVar45._8_4_ * auVar46._8_4_;
  auVar57._12_4_ = auVar37._12_4_ + auVar45._12_4_ * auVar46._12_4_;
  auVar37 = vsubps_avx(auVar47,auVar57);
  auVar46 = vaddps_avx512vl(auVar44,auVar54);
  auVar109._0_4_ = fVar210 + auVar57._0_4_;
  auVar109._4_4_ = fVar211 + auVar57._4_4_;
  auVar109._8_4_ = fVar128 + auVar57._8_4_;
  auVar109._12_4_ = fVar134 + auVar57._12_4_;
  auVar45 = vshufps_avx512vl(auVar48,auVar48,0xff);
  auVar217._0_4_ = auVar45._0_4_ * auVar239._0_4_;
  auVar217._4_4_ = auVar45._4_4_ * auVar239._4_4_;
  auVar217._8_4_ = auVar45._8_4_ * auVar239._8_4_;
  auVar217._12_4_ = auVar45._12_4_ * auVar239._12_4_;
  auVar54 = vsubps_avx512vl(auVar48,auVar217);
  auVar56 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar56 = vmulps_avx512vl(auVar56,auVar239);
  auVar137._0_4_ = auVar56._0_4_ + auVar45._0_4_ * fVar200 * auVar36._0_4_ * fVar215;
  auVar137._4_4_ = auVar56._4_4_ + auVar45._4_4_ * fVar200 * auVar36._4_4_ * fVar215;
  auVar137._8_4_ = auVar56._8_4_ + auVar45._8_4_ * fVar200 * auVar36._8_4_ * fVar215;
  auVar137._12_4_ = auVar56._12_4_ + auVar45._12_4_ * fVar200 * auVar36._12_4_ * fVar215;
  auVar36 = vsubps_avx(auVar53,auVar137);
  auVar45 = vaddps_avx512vl(auVar48,auVar217);
  auVar138._0_4_ = auVar53._0_4_ + auVar137._0_4_;
  auVar138._4_4_ = auVar53._4_4_ + auVar137._4_4_;
  auVar138._8_4_ = auVar53._8_4_ + auVar137._8_4_;
  auVar138._12_4_ = auVar53._12_4_ + auVar137._12_4_;
  auVar37 = vmulps_avx512vl(auVar37,auVar40);
  auVar151._0_4_ = auVar55._0_4_ + auVar37._0_4_;
  auVar151._4_4_ = auVar55._4_4_ + auVar37._4_4_;
  auVar151._8_4_ = auVar55._8_4_ + auVar37._8_4_;
  auVar151._12_4_ = auVar55._12_4_ + auVar37._12_4_;
  auVar37 = vmulps_avx512vl(auVar36,auVar40);
  auVar37 = vsubps_avx(auVar54,auVar37);
  auVar36 = vmulps_avx512vl(auVar109,auVar40);
  auVar44._0_4_ = auVar46._0_4_ + auVar36._0_4_;
  auVar44._4_4_ = auVar46._4_4_ + auVar36._4_4_;
  auVar44._8_4_ = auVar46._8_4_ + auVar36._8_4_;
  auVar44._12_4_ = auVar46._12_4_ + auVar36._12_4_;
  auVar36 = vmulps_avx512vl(auVar138,auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar251 = ZEXT1664(auVar40);
  auVar36 = vsubps_avx(auVar45,auVar36);
  auVar53 = vbroadcastss_avx512vl(auVar38);
  auVar56 = vsubss_avx512f(ZEXT416(0x3f800000),auVar38);
  auVar240._0_4_ = auVar56._0_4_;
  auVar240._4_4_ = auVar240._0_4_;
  auVar240._8_4_ = auVar240._0_4_;
  auVar240._12_4_ = auVar240._0_4_;
  auVar55 = vmulps_avx512vl(auVar53,auVar55);
  auVar56 = vmulps_avx512vl(auVar53,auVar151);
  auVar37 = vmulps_avx512vl(auVar53,auVar37);
  auVar233._0_4_ = auVar53._0_4_ * auVar54._0_4_;
  auVar233._4_4_ = auVar53._4_4_ * auVar54._4_4_;
  auVar233._8_4_ = auVar53._8_4_ * auVar54._8_4_;
  auVar233._12_4_ = auVar53._12_4_ * auVar54._12_4_;
  local_540 = vfmadd231ps_avx512vl(auVar55,auVar240,auVar49);
  local_550 = vfmadd231ps_avx512vl(auVar56,auVar240,auVar159);
  local_560 = vfmadd231ps_avx512vl(auVar37,auVar240,auVar52);
  local_570 = vfmadd231ps_fma(auVar233,auVar240,auVar51);
  auVar37 = vmulps_avx512vl(auVar53,auVar46);
  auVar46 = vmulps_avx512vl(auVar53,auVar44);
  auVar36 = vmulps_avx512vl(auVar53,auVar36);
  auVar228._0_4_ = auVar53._0_4_ * auVar45._0_4_;
  auVar228._4_4_ = auVar53._4_4_ * auVar45._4_4_;
  auVar228._8_4_ = auVar53._8_4_ * auVar45._8_4_;
  auVar228._12_4_ = auVar53._12_4_ * auVar45._12_4_;
  _local_580 = vfmadd231ps_avx512vl(auVar37,auVar240,auVar50);
  _local_590 = vfmadd231ps_avx512vl(auVar46,auVar240,auVar42);
  _local_5a0 = vfmadd231ps_avx512vl(auVar36,auVar240,auVar43);
  _local_5b0 = vfmadd231ps_fma(auVar228,auVar240,auVar39);
  auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_4c0 = vsubps_avx512vl(local_540,auVar37);
  uVar102 = local_4c0._0_4_;
  auVar38._4_4_ = uVar102;
  auVar38._0_4_ = uVar102;
  auVar38._8_4_ = uVar102;
  auVar38._12_4_ = uVar102;
  auVar36 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar46 = vshufps_avx(local_4c0,local_4c0,0xaa);
  aVar5 = pre->ray_space[k].vx.field_0;
  aVar6 = pre->ray_space[k].vy.field_0;
  fVar200 = pre->ray_space[k].vz.field_0.m128[0];
  fVar215 = pre->ray_space[k].vz.field_0.m128[1];
  fVar210 = pre->ray_space[k].vz.field_0.m128[2];
  fVar211 = pre->ray_space[k].vz.field_0.m128[3];
  auVar56._0_4_ = fVar200 * auVar46._0_4_;
  auVar56._4_4_ = fVar215 * auVar46._4_4_;
  auVar56._8_4_ = fVar210 * auVar46._8_4_;
  auVar56._12_4_ = fVar211 * auVar46._12_4_;
  auVar36 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar6,auVar36);
  auVar50 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar5,auVar38);
  local_4d0 = vsubps_avx512vl(local_550,auVar37);
  uVar102 = local_4d0._0_4_;
  auVar47._4_4_ = uVar102;
  auVar47._0_4_ = uVar102;
  auVar47._8_4_ = uVar102;
  auVar47._12_4_ = uVar102;
  auVar36 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar46 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar39._0_4_ = fVar200 * auVar46._0_4_;
  auVar39._4_4_ = fVar215 * auVar46._4_4_;
  auVar39._8_4_ = fVar210 * auVar46._8_4_;
  auVar39._12_4_ = fVar211 * auVar46._12_4_;
  auVar36 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar6,auVar36);
  auVar51 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar5,auVar47);
  local_4e0 = vsubps_avx512vl(local_560,auVar37);
  uVar102 = local_4e0._0_4_;
  auVar59._4_4_ = uVar102;
  auVar59._0_4_ = uVar102;
  auVar59._8_4_ = uVar102;
  auVar59._12_4_ = uVar102;
  auVar36 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar46 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar172._0_4_ = auVar46._0_4_ * fVar200;
  auVar172._4_4_ = auVar46._4_4_ * fVar215;
  auVar172._8_4_ = auVar46._8_4_ * fVar210;
  auVar172._12_4_ = auVar46._12_4_ * fVar211;
  auVar36 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar6,auVar36);
  auVar53 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar5,auVar59);
  local_4f0 = vsubps_avx(local_570,auVar37);
  uVar102 = local_4f0._0_4_;
  auVar60._4_4_ = uVar102;
  auVar60._0_4_ = uVar102;
  auVar60._8_4_ = uVar102;
  auVar60._12_4_ = uVar102;
  auVar36 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar46 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar181._0_4_ = auVar46._0_4_ * fVar200;
  auVar181._4_4_ = auVar46._4_4_ * fVar215;
  auVar181._8_4_ = auVar46._8_4_ * fVar210;
  auVar181._12_4_ = auVar46._12_4_ * fVar211;
  auVar36 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar6,auVar36);
  auVar54 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar5,auVar60);
  local_500 = vsubps_avx512vl(_local_580,auVar37);
  uVar102 = local_500._0_4_;
  auVar61._4_4_ = uVar102;
  auVar61._0_4_ = uVar102;
  auVar61._8_4_ = uVar102;
  auVar61._12_4_ = uVar102;
  auVar36 = vshufps_avx(local_500,local_500,0x55);
  auVar46 = vshufps_avx(local_500,local_500,0xaa);
  auVar193._0_4_ = auVar46._0_4_ * fVar200;
  auVar193._4_4_ = auVar46._4_4_ * fVar215;
  auVar193._8_4_ = auVar46._8_4_ * fVar210;
  auVar193._12_4_ = auVar46._12_4_ * fVar211;
  auVar36 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar6,auVar36);
  auVar56 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar5,auVar61);
  local_510 = vsubps_avx512vl(_local_590,auVar37);
  uVar102 = local_510._0_4_;
  auVar62._4_4_ = uVar102;
  auVar62._0_4_ = uVar102;
  auVar62._8_4_ = uVar102;
  auVar62._12_4_ = uVar102;
  auVar36 = vshufps_avx(local_510,local_510,0x55);
  auVar46 = vshufps_avx(local_510,local_510,0xaa);
  auVar201._0_4_ = auVar46._0_4_ * fVar200;
  auVar201._4_4_ = auVar46._4_4_ * fVar215;
  auVar201._8_4_ = auVar46._8_4_ * fVar210;
  auVar201._12_4_ = auVar46._12_4_ * fVar211;
  auVar36 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar6,auVar36);
  auVar57 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar5,auVar62);
  local_520 = vsubps_avx512vl(_local_5a0,auVar37);
  uVar102 = local_520._0_4_;
  auVar119._4_4_ = uVar102;
  auVar119._0_4_ = uVar102;
  auVar119._8_4_ = uVar102;
  auVar119._12_4_ = uVar102;
  auVar36 = vshufps_avx(local_520,local_520,0x55);
  auVar46 = vshufps_avx(local_520,local_520,0xaa);
  auVar218._0_4_ = auVar46._0_4_ * fVar200;
  auVar218._4_4_ = auVar46._4_4_ * fVar215;
  auVar218._8_4_ = auVar46._8_4_ * fVar210;
  auVar218._12_4_ = auVar46._12_4_ * fVar211;
  auVar36 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar6,auVar36);
  auVar58 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar5,auVar119);
  local_530 = vsubps_avx(_local_5b0,auVar37);
  uVar102 = local_530._0_4_;
  auVar43._4_4_ = uVar102;
  auVar43._0_4_ = uVar102;
  auVar43._8_4_ = uVar102;
  auVar43._12_4_ = uVar102;
  auVar37 = vshufps_avx(local_530,local_530,0x55);
  auVar36 = vshufps_avx(local_530,local_530,0xaa);
  auVar152._0_4_ = fVar200 * auVar36._0_4_;
  auVar152._4_4_ = fVar215 * auVar36._4_4_;
  auVar152._8_4_ = fVar210 * auVar36._8_4_;
  auVar152._12_4_ = fVar211 * auVar36._12_4_;
  auVar37 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar6,auVar37);
  auVar109 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar5,auVar43);
  auVar46 = vmovlhps_avx(auVar50,auVar56);
  auVar45 = vmovlhps_avx(auVar51,auVar57);
  auVar52 = vmovlhps_avx(auVar53,auVar58);
  _local_4a0 = vmovlhps_avx512f(auVar54,auVar109);
  auVar36 = vminps_avx(auVar46,auVar45);
  auVar37 = vmaxps_avx(auVar46,auVar45);
  auVar49 = vminps_avx512vl(auVar52,_local_4a0);
  auVar36 = vminps_avx(auVar36,auVar49);
  auVar49 = vmaxps_avx512vl(auVar52,_local_4a0);
  auVar37 = vmaxps_avx(auVar37,auVar49);
  auVar49 = vshufpd_avx(auVar36,auVar36,3);
  auVar36 = vminps_avx(auVar36,auVar49);
  auVar49 = vshufpd_avx(auVar37,auVar37,3);
  auVar37 = vmaxps_avx(auVar37,auVar49);
  auVar36 = vandps_avx512vl(auVar36,auVar40);
  auVar37 = vandps_avx512vl(auVar37,auVar40);
  auVar37 = vmaxps_avx(auVar36,auVar37);
  auVar36 = vmovshdup_avx(auVar37);
  auVar37 = vmaxss_avx(auVar36,auVar37);
  auVar36 = vmovddup_avx512vl(auVar50);
  auVar49 = vmovddup_avx512vl(auVar51);
  auVar173._0_8_ = auVar53._0_8_;
  auVar173._8_8_ = auVar173._0_8_;
  auVar182._0_8_ = auVar54._0_8_;
  auVar182._8_8_ = auVar182._0_8_;
  local_4b0 = ZEXT416((uint)(auVar37._0_4_ * 9.536743e-07));
  local_440 = vbroadcastss_avx512vl(local_4b0);
  auVar37 = vxorps_avx512vl(local_440._0_16_,auVar41);
  local_460 = vbroadcastss_avx512vl(auVar37);
  bVar31 = false;
  uVar24 = 0;
  uVar3 = *(uint *)(ray + k * 4 + 0xc0);
  local_470 = vsubps_avx(auVar45,auVar46);
  local_480 = vsubps_avx(auVar52,auVar45);
  local_490 = vsubps_avx512vl(_local_4a0,auVar52);
  local_5c0 = vsubps_avx512vl(_local_580,local_540);
  local_5d0 = vsubps_avx512vl(_local_590,local_550);
  local_5e0 = vsubps_avx512vl(_local_5a0,local_560);
  auVar79 = vbroadcastss_avx512vl(ZEXT416(3));
  _local_5f0 = vsubps_avx(_local_5b0,local_570);
  auVar107 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar107);
  auVar37 = ZEXT816(0x3f80000000000000);
  auVar99._32_32_ = auVar107._32_32_;
  auVar55 = auVar37;
LAB_01b579c9:
  auVar50 = vshufps_avx(auVar55,auVar55,0x50);
  auVar234._8_4_ = 0x3f800000;
  auVar234._0_8_ = 0x3f8000003f800000;
  auVar234._12_4_ = 0x3f800000;
  auVar237._16_4_ = 0x3f800000;
  auVar237._0_16_ = auVar234;
  auVar237._20_4_ = 0x3f800000;
  auVar237._24_4_ = 0x3f800000;
  auVar237._28_4_ = 0x3f800000;
  auVar51 = vsubps_avx(auVar234,auVar50);
  fVar200 = auVar50._0_4_;
  fVar128 = auVar56._0_4_;
  auVar130._0_4_ = fVar128 * fVar200;
  fVar215 = auVar50._4_4_;
  fVar134 = auVar56._4_4_;
  auVar130._4_4_ = fVar134 * fVar215;
  fVar210 = auVar50._8_4_;
  auVar130._8_4_ = fVar128 * fVar210;
  fVar211 = auVar50._12_4_;
  auVar130._12_4_ = fVar134 * fVar211;
  fVar192 = auVar57._0_4_;
  auVar139._0_4_ = fVar192 * fVar200;
  fVar118 = auVar57._4_4_;
  auVar139._4_4_ = fVar118 * fVar215;
  auVar139._8_4_ = fVar192 * fVar210;
  auVar139._12_4_ = fVar118 * fVar211;
  fVar126 = auVar58._0_4_;
  auVar153._0_4_ = fVar126 * fVar200;
  fVar127 = auVar58._4_4_;
  auVar153._4_4_ = fVar127 * fVar215;
  auVar153._8_4_ = fVar126 * fVar210;
  auVar153._12_4_ = fVar127 * fVar211;
  fVar216 = auVar109._0_4_;
  auVar111._0_4_ = fVar216 * fVar200;
  fVar225 = auVar109._4_4_;
  auVar111._4_4_ = fVar225 * fVar215;
  auVar111._8_4_ = fVar216 * fVar210;
  auVar111._12_4_ = fVar225 * fVar211;
  auVar54 = vfmadd231ps_avx512vl(auVar130,auVar51,auVar36);
  auVar38 = vfmadd231ps_avx512vl(auVar139,auVar51,auVar49);
  auVar53 = vfmadd231ps_fma(auVar153,auVar51,auVar173);
  auVar51 = vfmadd231ps_fma(auVar111,auVar182,auVar51);
  auVar50 = vmovshdup_avx(auVar37);
  fVar200 = auVar37._0_4_;
  auVar39 = vmulss_avx512f(ZEXT416((uint)(auVar50._0_4_ - fVar200)),ZEXT416(0x3d430c31));
  auVar178._4_4_ = fVar200;
  auVar178._0_4_ = fVar200;
  auVar178._8_4_ = fVar200;
  auVar178._12_4_ = fVar200;
  auVar178._16_4_ = fVar200;
  auVar178._20_4_ = fVar200;
  auVar178._24_4_ = fVar200;
  auVar178._28_4_ = fVar200;
  auVar124._0_8_ = auVar50._0_8_;
  auVar124._8_8_ = auVar124._0_8_;
  auVar124._16_8_ = auVar124._0_8_;
  auVar124._24_8_ = auVar124._0_8_;
  auVar82 = vsubps_avx(auVar124,auVar178);
  uVar102 = auVar54._0_4_;
  auVar125._4_4_ = uVar102;
  auVar125._0_4_ = uVar102;
  auVar125._8_4_ = uVar102;
  auVar125._12_4_ = uVar102;
  auVar125._16_4_ = uVar102;
  auVar125._20_4_ = uVar102;
  auVar125._24_4_ = uVar102;
  auVar125._28_4_ = uVar102;
  auVar197._8_4_ = 1;
  auVar197._0_8_ = 0x100000001;
  auVar197._12_4_ = 1;
  auVar197._16_4_ = 1;
  auVar197._20_4_ = 1;
  auVar197._24_4_ = 1;
  auVar197._28_4_ = 1;
  auVar80 = ZEXT1632(auVar54);
  auVar81 = vpermps_avx2(auVar197,auVar80);
  auVar76 = vbroadcastss_avx512vl(auVar38);
  auVar64 = ZEXT1632(auVar38);
  auVar77 = vpermps_avx512vl(auVar197,auVar64);
  auVar78 = vbroadcastss_avx512vl(auVar53);
  auVar65 = ZEXT1632(auVar53);
  auVar71 = vpermps_avx512vl(auVar197,auVar65);
  auVar72 = vbroadcastss_avx512vl(auVar51);
  auVar63 = ZEXT1632(auVar51);
  auVar83 = vpermps_avx512vl(auVar197,auVar63);
  fVar215 = auVar39._0_4_;
  auVar198._4_4_ = fVar215;
  auVar198._0_4_ = fVar215;
  auVar198._8_4_ = fVar215;
  auVar198._12_4_ = fVar215;
  auVar198._16_4_ = fVar215;
  auVar198._20_4_ = fVar215;
  auVar198._24_4_ = fVar215;
  auVar198._28_4_ = fVar215;
  auVar166._8_4_ = 2;
  auVar166._0_8_ = 0x200000002;
  auVar166._12_4_ = 2;
  auVar166._16_4_ = 2;
  auVar166._20_4_ = 2;
  auVar166._24_4_ = 2;
  auVar166._28_4_ = 2;
  auVar84 = vpermps_avx512vl(auVar166,auVar80);
  auVar85 = vpermps_avx512vl(auVar79,auVar80);
  auVar86 = vpermps_avx512vl(auVar166,auVar64);
  auVar66 = vpermps_avx512vl(auVar79,auVar64);
  auVar80 = vpermps_avx2(auVar166,auVar65);
  auVar67 = vpermps_avx512vl(auVar79,auVar65);
  auVar68 = vpermps_avx512vl(auVar166,auVar63);
  auVar69 = vpermps_avx512vl(auVar79,auVar63);
  auVar50 = vfmadd132ps_fma(auVar82,auVar178,_DAT_01f7b040);
  auVar79 = vsubps_avx(auVar237,ZEXT1632(auVar50));
  auVar82 = vmulps_avx512vl(auVar76,ZEXT1632(auVar50));
  auVar64 = ZEXT1632(auVar50);
  auVar63 = vmulps_avx512vl(auVar77,auVar64);
  auVar51 = vfmadd231ps_fma(auVar82,auVar79,auVar125);
  auVar53 = vfmadd231ps_fma(auVar63,auVar79,auVar81);
  auVar82 = vmulps_avx512vl(auVar78,auVar64);
  auVar63 = vmulps_avx512vl(auVar71,auVar64);
  auVar82 = vfmadd231ps_avx512vl(auVar82,auVar79,auVar76);
  auVar76 = vfmadd231ps_avx512vl(auVar63,auVar79,auVar77);
  auVar77 = vmulps_avx512vl(auVar72,auVar64);
  auVar70 = ZEXT1632(auVar50);
  auVar83 = vmulps_avx512vl(auVar83,auVar70);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar79,auVar78);
  auVar78 = vfmadd231ps_avx512vl(auVar83,auVar79,auVar71);
  fVar210 = auVar50._0_4_;
  fVar211 = auVar50._4_4_;
  auVar63._4_4_ = fVar211 * auVar82._4_4_;
  auVar63._0_4_ = fVar210 * auVar82._0_4_;
  fVar212 = auVar50._8_4_;
  auVar63._8_4_ = fVar212 * auVar82._8_4_;
  fVar213 = auVar50._12_4_;
  auVar63._12_4_ = fVar213 * auVar82._12_4_;
  auVar63._16_4_ = auVar82._16_4_ * 0.0;
  auVar63._20_4_ = auVar82._20_4_ * 0.0;
  auVar63._24_4_ = auVar82._24_4_ * 0.0;
  auVar63._28_4_ = fVar200;
  auVar64._4_4_ = fVar211 * auVar76._4_4_;
  auVar64._0_4_ = fVar210 * auVar76._0_4_;
  auVar64._8_4_ = fVar212 * auVar76._8_4_;
  auVar64._12_4_ = fVar213 * auVar76._12_4_;
  auVar64._16_4_ = auVar76._16_4_ * 0.0;
  auVar64._20_4_ = auVar76._20_4_ * 0.0;
  auVar64._24_4_ = auVar76._24_4_ * 0.0;
  auVar64._28_4_ = auVar81._28_4_;
  auVar51 = vfmadd231ps_fma(auVar63,auVar79,ZEXT1632(auVar51));
  auVar53 = vfmadd231ps_fma(auVar64,auVar79,ZEXT1632(auVar53));
  auVar116._0_4_ = fVar210 * auVar77._0_4_;
  auVar116._4_4_ = fVar211 * auVar77._4_4_;
  auVar116._8_4_ = fVar212 * auVar77._8_4_;
  auVar116._12_4_ = fVar213 * auVar77._12_4_;
  auVar116._16_4_ = auVar77._16_4_ * 0.0;
  auVar116._20_4_ = auVar77._20_4_ * 0.0;
  auVar116._24_4_ = auVar77._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar65._4_4_ = fVar211 * auVar78._4_4_;
  auVar65._0_4_ = fVar210 * auVar78._0_4_;
  auVar65._8_4_ = fVar212 * auVar78._8_4_;
  auVar65._12_4_ = fVar213 * auVar78._12_4_;
  auVar65._16_4_ = auVar78._16_4_ * 0.0;
  auVar65._20_4_ = auVar78._20_4_ * 0.0;
  auVar65._24_4_ = auVar78._24_4_ * 0.0;
  auVar65._28_4_ = auVar77._28_4_;
  auVar54 = vfmadd231ps_fma(auVar116,auVar79,auVar82);
  auVar38 = vfmadd231ps_fma(auVar65,auVar79,auVar76);
  auVar74._28_4_ = auVar76._28_4_;
  auVar74._0_28_ =
       ZEXT1628(CONCAT412(fVar213 * auVar38._12_4_,
                          CONCAT48(fVar212 * auVar38._8_4_,
                                   CONCAT44(fVar211 * auVar38._4_4_,fVar210 * auVar38._0_4_))));
  auVar39 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar213 * auVar54._12_4_,
                                               CONCAT48(fVar212 * auVar54._8_4_,
                                                        CONCAT44(fVar211 * auVar54._4_4_,
                                                                 fVar210 * auVar54._0_4_)))),auVar79
                            ,ZEXT1632(auVar51));
  auVar40 = vfmadd231ps_fma(auVar74,auVar79,ZEXT1632(auVar53));
  auVar82 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar51));
  auVar81 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar53));
  auVar76 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar82 = vmulps_avx512vl(auVar82,auVar76);
  auVar81 = vmulps_avx512vl(auVar81,auVar76);
  auVar191._0_4_ = fVar215 * auVar82._0_4_;
  auVar191._4_4_ = fVar215 * auVar82._4_4_;
  auVar191._8_4_ = fVar215 * auVar82._8_4_;
  auVar191._12_4_ = fVar215 * auVar82._12_4_;
  auVar191._16_4_ = fVar215 * auVar82._16_4_;
  auVar191._20_4_ = fVar215 * auVar82._20_4_;
  auVar191._24_4_ = fVar215 * auVar82._24_4_;
  auVar191._28_4_ = 0;
  auVar82 = vmulps_avx512vl(auVar198,auVar81);
  auVar53 = vxorps_avx512vl(auVar72._0_16_,auVar72._0_16_);
  auVar81 = vpermt2ps_avx512vl(ZEXT1632(auVar39),_DAT_01fb9fc0,ZEXT1632(auVar53));
  auVar77 = vpermt2ps_avx512vl(ZEXT1632(auVar40),_DAT_01fb9fc0,ZEXT1632(auVar53));
  auVar117._0_4_ = auVar191._0_4_ + auVar39._0_4_;
  auVar117._4_4_ = auVar191._4_4_ + auVar39._4_4_;
  auVar117._8_4_ = auVar191._8_4_ + auVar39._8_4_;
  auVar117._12_4_ = auVar191._12_4_ + auVar39._12_4_;
  auVar117._16_4_ = auVar191._16_4_ + 0.0;
  auVar117._20_4_ = auVar191._20_4_ + 0.0;
  auVar117._24_4_ = auVar191._24_4_ + 0.0;
  auVar117._28_4_ = 0;
  auVar65 = ZEXT1632(auVar53);
  auVar78 = vpermt2ps_avx512vl(auVar191,_DAT_01fb9fc0,auVar65);
  auVar71 = vaddps_avx512vl(ZEXT1632(auVar40),auVar82);
  auVar72 = vpermt2ps_avx512vl(auVar82,_DAT_01fb9fc0,auVar65);
  auVar82 = vsubps_avx(auVar81,auVar78);
  auVar78 = vsubps_avx512vl(auVar77,auVar72);
  auVar72 = vmulps_avx512vl(auVar86,auVar70);
  auVar83 = vmulps_avx512vl(auVar66,auVar70);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar79,auVar84);
  auVar83 = vfmadd231ps_avx512vl(auVar83,auVar79,auVar85);
  auVar84 = vmulps_avx512vl(auVar80,auVar70);
  auVar85 = vmulps_avx512vl(auVar67,auVar70);
  auVar84 = vfmadd231ps_avx512vl(auVar84,auVar79,auVar86);
  auVar85 = vfmadd231ps_avx512vl(auVar85,auVar79,auVar66);
  auVar86 = vmulps_avx512vl(auVar68,auVar70);
  auVar63 = vmulps_avx512vl(auVar69,auVar70);
  auVar51 = vfmadd231ps_fma(auVar86,auVar79,auVar80);
  auVar80 = vfmadd231ps_avx512vl(auVar63,auVar79,auVar67);
  auVar86 = vmulps_avx512vl(auVar70,auVar84);
  auVar64 = ZEXT1632(auVar50);
  auVar63 = vmulps_avx512vl(auVar64,auVar85);
  auVar72 = vfmadd231ps_avx512vl(auVar86,auVar79,auVar72);
  auVar83 = vfmadd231ps_avx512vl(auVar63,auVar79,auVar83);
  auVar80 = vmulps_avx512vl(auVar64,auVar80);
  auVar84 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar213 * auVar51._12_4_,
                                          CONCAT48(fVar212 * auVar51._8_4_,
                                                   CONCAT44(fVar211 * auVar51._4_4_,
                                                            fVar210 * auVar51._0_4_)))),auVar79,
                       auVar84);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar79,auVar85);
  auVar75._4_4_ = fVar211 * auVar84._4_4_;
  auVar75._0_4_ = fVar210 * auVar84._0_4_;
  auVar75._8_4_ = fVar212 * auVar84._8_4_;
  auVar75._12_4_ = fVar213 * auVar84._12_4_;
  auVar75._16_4_ = auVar84._16_4_ * 0.0;
  auVar75._20_4_ = auVar84._20_4_ * 0.0;
  auVar75._24_4_ = auVar84._24_4_ * 0.0;
  auVar75._28_4_ = auVar67._28_4_;
  auVar85 = vmulps_avx512vl(auVar64,auVar80);
  auVar86 = vfmadd231ps_avx512vl(auVar75,auVar79,auVar72);
  auVar85 = vfmadd231ps_avx512vl(auVar85,auVar83,auVar79);
  auVar79 = vsubps_avx512vl(auVar84,auVar72);
  auVar80 = vsubps_avx512vl(auVar80,auVar83);
  auVar79 = vmulps_avx512vl(auVar79,auVar76);
  auVar80 = vmulps_avx512vl(auVar80,auVar76);
  fVar200 = fVar215 * auVar79._0_4_;
  fVar210 = fVar215 * auVar79._4_4_;
  auVar21._4_4_ = fVar210;
  auVar21._0_4_ = fVar200;
  fVar211 = fVar215 * auVar79._8_4_;
  auVar21._8_4_ = fVar211;
  fVar212 = fVar215 * auVar79._12_4_;
  auVar21._12_4_ = fVar212;
  fVar213 = fVar215 * auVar79._16_4_;
  auVar21._16_4_ = fVar213;
  fVar214 = fVar215 * auVar79._20_4_;
  auVar21._20_4_ = fVar214;
  fVar215 = fVar215 * auVar79._24_4_;
  auVar21._24_4_ = fVar215;
  auVar21._28_4_ = auVar79._28_4_;
  auVar80 = vmulps_avx512vl(auVar198,auVar80);
  auVar76 = vpermt2ps_avx512vl(auVar86,_DAT_01fb9fc0,auVar65);
  auVar72 = vpermt2ps_avx512vl(auVar85,_DAT_01fb9fc0,auVar65);
  auVar199._0_4_ = auVar86._0_4_ + fVar200;
  auVar199._4_4_ = auVar86._4_4_ + fVar210;
  auVar199._8_4_ = auVar86._8_4_ + fVar211;
  auVar199._12_4_ = auVar86._12_4_ + fVar212;
  auVar199._16_4_ = auVar86._16_4_ + fVar213;
  auVar199._20_4_ = auVar86._20_4_ + fVar214;
  auVar199._24_4_ = auVar86._24_4_ + fVar215;
  auVar199._28_4_ = auVar86._28_4_ + auVar79._28_4_;
  auVar79 = vpermt2ps_avx512vl(auVar21,_DAT_01fb9fc0,ZEXT1632(auVar53));
  auVar83 = vaddps_avx512vl(auVar85,auVar80);
  auVar80 = vpermt2ps_avx512vl(auVar80,_DAT_01fb9fc0,ZEXT1632(auVar53));
  auVar79 = vsubps_avx(auVar76,auVar79);
  auVar80 = vsubps_avx512vl(auVar72,auVar80);
  auVar73 = ZEXT1632(auVar39);
  auVar84 = vsubps_avx512vl(auVar86,auVar73);
  auVar74 = ZEXT1632(auVar40);
  auVar63 = vsubps_avx512vl(auVar85,auVar74);
  auVar64 = vsubps_avx512vl(auVar76,auVar81);
  auVar84 = vaddps_avx512vl(auVar84,auVar64);
  auVar64 = vsubps_avx512vl(auVar72,auVar77);
  auVar63 = vaddps_avx512vl(auVar63,auVar64);
  auVar64 = vmulps_avx512vl(auVar74,auVar84);
  auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar73,auVar63);
  auVar65 = vmulps_avx512vl(auVar71,auVar84);
  auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar117,auVar63);
  auVar66 = vmulps_avx512vl(auVar78,auVar84);
  auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar82,auVar63);
  auVar67 = vmulps_avx512vl(auVar77,auVar84);
  auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar81,auVar63);
  auVar68 = vmulps_avx512vl(auVar85,auVar84);
  auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar86,auVar63);
  auVar69 = vmulps_avx512vl(auVar83,auVar84);
  auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar199,auVar63);
  auVar70 = vmulps_avx512vl(auVar80,auVar84);
  auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar79,auVar63);
  auVar84 = vmulps_avx512vl(auVar72,auVar84);
  auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar76,auVar63);
  auVar63 = vminps_avx512vl(auVar64,auVar65);
  auVar64 = vmaxps_avx512vl(auVar64,auVar65);
  auVar65 = vminps_avx512vl(auVar66,auVar67);
  auVar63 = vminps_avx512vl(auVar63,auVar65);
  auVar65 = vmaxps_avx512vl(auVar66,auVar67);
  auVar64 = vmaxps_avx512vl(auVar64,auVar65);
  auVar65 = vminps_avx512vl(auVar68,auVar69);
  auVar66 = vmaxps_avx512vl(auVar68,auVar69);
  auVar67 = vminps_avx512vl(auVar70,auVar84);
  auVar65 = vminps_avx512vl(auVar65,auVar67);
  auVar63 = vminps_avx512vl(auVar63,auVar65);
  auVar50 = auVar63._0_16_;
  auVar84 = vmaxps_avx512vl(auVar70,auVar84);
  auVar84 = vmaxps_avx512vl(auVar66,auVar84);
  auVar84 = vmaxps_avx512vl(auVar64,auVar84);
  uVar15 = vcmpps_avx512vl(auVar63,local_440,2);
  uVar16 = vcmpps_avx512vl(auVar84,local_460,5);
  bVar22 = (byte)uVar15 & (byte)uVar16 & 0x7f;
  if (bVar22 != 0) {
    auVar84 = vsubps_avx512vl(auVar81,auVar73);
    auVar63 = vsubps_avx512vl(auVar77,auVar74);
    auVar64 = vsubps_avx512vl(auVar76,auVar86);
    auVar84 = vaddps_avx512vl(auVar84,auVar64);
    auVar64 = vsubps_avx512vl(auVar72,auVar85);
    auVar63 = vaddps_avx512vl(auVar63,auVar64);
    auVar50 = auVar63._0_16_;
    auVar64 = vmulps_avx512vl(auVar74,auVar84);
    auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar63,auVar73);
    auVar71 = vmulps_avx512vl(auVar71,auVar84);
    auVar71 = vfnmadd213ps_avx512vl(auVar117,auVar63,auVar71);
    auVar78 = vmulps_avx512vl(auVar78,auVar84);
    auVar78 = vfnmadd213ps_avx512vl(auVar82,auVar63,auVar78);
    auVar82 = vmulps_avx512vl(auVar77,auVar84);
    auVar77 = vfnmadd231ps_avx512vl(auVar82,auVar63,auVar81);
    auVar82 = vmulps_avx512vl(auVar85,auVar84);
    auVar85 = vfnmadd231ps_avx512vl(auVar82,auVar63,auVar86);
    auVar82 = vmulps_avx512vl(auVar83,auVar84);
    auVar83 = vfnmadd213ps_avx512vl(auVar199,auVar63,auVar82);
    auVar82 = vmulps_avx512vl(auVar80,auVar84);
    auVar86 = vfnmadd213ps_avx512vl(auVar79,auVar63,auVar82);
    auVar79 = vmulps_avx512vl(auVar72,auVar84);
    auVar72 = vfnmadd231ps_avx512vl(auVar79,auVar76,auVar63);
    auVar82 = vminps_avx(auVar64,auVar71);
    auVar79 = vmaxps_avx(auVar64,auVar71);
    auVar81 = vminps_avx(auVar78,auVar77);
    auVar81 = vminps_avx(auVar82,auVar81);
    auVar82 = vmaxps_avx(auVar78,auVar77);
    auVar79 = vmaxps_avx(auVar79,auVar82);
    auVar80 = vminps_avx(auVar85,auVar83);
    auVar82 = vmaxps_avx(auVar85,auVar83);
    auVar76 = vminps_avx(auVar86,auVar72);
    auVar80 = vminps_avx(auVar80,auVar76);
    auVar80 = vminps_avx(auVar81,auVar80);
    auVar81 = vmaxps_avx(auVar86,auVar72);
    auVar82 = vmaxps_avx(auVar82,auVar81);
    auVar79 = vmaxps_avx(auVar79,auVar82);
    uVar15 = vcmpps_avx512vl(auVar79,local_460,5);
    uVar16 = vcmpps_avx512vl(auVar80,local_440,2);
    bVar22 = bVar22 & (byte)uVar15 & (byte)uVar16;
    if (bVar22 != 0) {
      auStack_630[uVar24] = (uint)bVar22;
      uVar15 = vmovlps_avx(auVar37);
      (&uStack_420)[uVar24] = uVar15;
      uVar4 = vmovlps_avx(auVar55);
      auStack_3a0[uVar24] = uVar4;
      uVar24 = (ulong)((int)uVar24 + 1);
    }
  }
  auVar37 = vxorps_avx512vl(auVar50,auVar50);
  auVar107 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar253 = ZEXT1664(auVar37);
  auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar246 = ZEXT3264(auVar79);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar247 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar248 = ZEXT1664(auVar37);
  auVar100._32_32_ = auVar99._32_32_;
  auVar100._0_32_ = _DAT_01fb9fe0;
  auVar249 = ZEXT3264(_DAT_01fb9fe0);
LAB_01b57eb9:
  do {
    do {
      do {
        auVar50 = auVar107._0_16_;
        auVar51 = auVar248._0_16_;
        if ((int)uVar24 == 0) {
          if (bVar31) goto LAB_01b58dee;
          uVar102 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar20._4_4_ = uVar102;
          auVar20._0_4_ = uVar102;
          auVar20._8_4_ = uVar102;
          auVar20._12_4_ = uVar102;
          auVar20._16_4_ = uVar102;
          auVar20._20_4_ = uVar102;
          auVar20._24_4_ = uVar102;
          auVar20._28_4_ = uVar102;
          uVar15 = vcmpps_avx512vl(local_3c0,auVar20,2);
          uVar30 = (ulong)((uint)uVar30 & (uint)uVar30 + 0xff & (uint)uVar15);
          goto LAB_01b56e53;
        }
        uVar23 = (int)uVar24 - 1;
        uVar25 = (ulong)uVar23;
        uVar8 = auStack_630[uVar25];
        auVar55._8_8_ = 0;
        auVar55._0_8_ = auStack_3a0[uVar25];
        uVar4 = 0;
        for (uVar28 = (ulong)uVar8; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
          uVar4 = uVar4 + 1;
        }
        uVar26 = uVar8 - 1 & uVar8;
        bVar34 = uVar26 == 0;
        auStack_630[uVar25] = uVar26;
        if (bVar34) {
          uVar24 = (ulong)uVar23;
        }
        auVar103._8_8_ = 0;
        auVar103._0_8_ = uVar4;
        auVar37 = vpunpcklqdq_avx(auVar103,ZEXT416((int)uVar4 + 1));
        auVar37 = vcvtqq2ps_avx512vl(auVar37);
        auVar37 = vmulps_avx512vl(auVar37,auVar247._0_16_);
        uVar102 = *(undefined4 *)((long)&uStack_420 + uVar25 * 8 + 4);
        auVar17._4_4_ = uVar102;
        auVar17._0_4_ = uVar102;
        auVar17._8_4_ = uVar102;
        auVar17._12_4_ = uVar102;
        auVar53 = vmulps_avx512vl(auVar37,auVar17);
        auVar37 = vsubps_avx512vl(auVar51,auVar37);
        uVar102 = *(undefined4 *)(&uStack_420 + uVar25);
        auVar18._4_4_ = uVar102;
        auVar18._0_4_ = uVar102;
        auVar18._8_4_ = uVar102;
        auVar18._12_4_ = uVar102;
        auVar37 = vfmadd231ps_avx512vl(auVar53,auVar37,auVar18);
        auVar99._32_32_ = auVar100._32_32_;
        auVar53 = vmovshdup_avx(auVar37);
        fVar200 = auVar53._0_4_ - auVar37._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar200));
        if (uVar8 == 0 || bVar34) goto LAB_01b58d5e;
        auVar53 = vshufps_avx(auVar55,auVar55,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar200));
        auVar39 = vsubps_avx512vl(auVar51,auVar53);
        fVar215 = auVar53._0_4_;
        auVar140._0_4_ = fVar215 * fVar128;
        fVar210 = auVar53._4_4_;
        auVar140._4_4_ = fVar210 * fVar134;
        fVar211 = auVar53._8_4_;
        auVar140._8_4_ = fVar211 * fVar128;
        fVar212 = auVar53._12_4_;
        auVar140._12_4_ = fVar212 * fVar134;
        auVar154._0_4_ = fVar215 * fVar192;
        auVar154._4_4_ = fVar210 * fVar118;
        auVar154._8_4_ = fVar211 * fVar192;
        auVar154._12_4_ = fVar212 * fVar118;
        auVar160._0_4_ = fVar215 * fVar126;
        auVar160._4_4_ = fVar210 * fVar127;
        auVar160._8_4_ = fVar211 * fVar126;
        auVar160._12_4_ = fVar212 * fVar127;
        auVar120._0_4_ = fVar215 * fVar216;
        auVar120._4_4_ = fVar210 * fVar225;
        auVar120._8_4_ = fVar211 * fVar216;
        auVar120._12_4_ = fVar212 * fVar225;
        auVar53 = vfmadd231ps_fma(auVar140,auVar39,auVar36);
        auVar54 = vfmadd231ps_fma(auVar154,auVar39,auVar49);
        auVar38 = vfmadd231ps_fma(auVar160,auVar39,auVar173);
        auVar39 = vfmadd231ps_fma(auVar120,auVar39,auVar182);
        auVar133._16_16_ = auVar53;
        auVar133._0_16_ = auVar53;
        auVar146._16_16_ = auVar54;
        auVar146._0_16_ = auVar54;
        auVar158._16_16_ = auVar38;
        auVar158._0_16_ = auVar38;
        auVar82 = vpermps_avx512vl(auVar249._0_32_,ZEXT1632(auVar37));
        auVar79 = vsubps_avx(auVar146,auVar133);
        auVar54 = vfmadd213ps_fma(auVar79,auVar82,auVar133);
        auVar79 = vsubps_avx(auVar158,auVar146);
        auVar40 = vfmadd213ps_fma(auVar79,auVar82,auVar146);
        auVar53 = vsubps_avx(auVar39,auVar38);
        auVar147._16_16_ = auVar53;
        auVar147._0_16_ = auVar53;
        auVar53 = vfmadd213ps_fma(auVar147,auVar82,auVar158);
        auVar79 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar54));
        auVar54 = vfmadd213ps_fma(auVar79,auVar82,ZEXT1632(auVar54));
        auVar79 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar40));
        auVar53 = vfmadd213ps_fma(auVar79,auVar82,ZEXT1632(auVar40));
        auVar79 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar54));
        auVar108 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar79,auVar82);
        auVar99._0_32_ = vmulps_avx512vl(auVar79,auVar246._0_32_);
        fVar215 = fVar200 * 0.33333334;
        auVar161._0_8_ =
             CONCAT44(auVar108._4_4_ + fVar215 * auVar99._4_4_,
                      auVar108._0_4_ + fVar215 * auVar99._0_4_);
        auVar161._8_4_ = auVar108._8_4_ + fVar215 * auVar99._8_4_;
        auVar161._12_4_ = auVar108._12_4_ + fVar215 * auVar99._12_4_;
        auVar141._0_4_ = fVar215 * auVar99._16_4_;
        auVar141._4_4_ = fVar215 * auVar99._20_4_;
        auVar141._8_4_ = fVar215 * auVar99._24_4_;
        auVar141._12_4_ = fVar215 * auVar99._28_4_;
        auVar44 = vsubps_avx((undefined1  [16])0x0,auVar141);
        auVar40 = vshufpd_avx(auVar108,auVar108,3);
        auVar41 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar53 = vsubps_avx(auVar40,auVar108);
        auVar54 = vsubps_avx(auVar41,(undefined1  [16])0x0);
        auVar183._0_4_ = auVar53._0_4_ + auVar54._0_4_;
        auVar183._4_4_ = auVar53._4_4_ + auVar54._4_4_;
        auVar183._8_4_ = auVar53._8_4_ + auVar54._8_4_;
        auVar183._12_4_ = auVar53._12_4_ + auVar54._12_4_;
        auVar53 = vshufps_avx(auVar108,auVar108,0xb1);
        auVar54 = vshufps_avx(auVar161,auVar161,0xb1);
        auVar38 = vshufps_avx(auVar44,auVar44,0xb1);
        auVar39 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar235._4_4_ = auVar183._0_4_;
        auVar235._0_4_ = auVar183._0_4_;
        auVar235._8_4_ = auVar183._0_4_;
        auVar235._12_4_ = auVar183._0_4_;
        auVar42 = vshufps_avx(auVar183,auVar183,0x55);
        fVar215 = auVar42._0_4_;
        auVar194._0_4_ = auVar53._0_4_ * fVar215;
        fVar210 = auVar42._4_4_;
        auVar194._4_4_ = auVar53._4_4_ * fVar210;
        fVar211 = auVar42._8_4_;
        auVar194._8_4_ = auVar53._8_4_ * fVar211;
        fVar212 = auVar42._12_4_;
        auVar194._12_4_ = auVar53._12_4_ * fVar212;
        auVar202._0_4_ = auVar54._0_4_ * fVar215;
        auVar202._4_4_ = auVar54._4_4_ * fVar210;
        auVar202._8_4_ = auVar54._8_4_ * fVar211;
        auVar202._12_4_ = auVar54._12_4_ * fVar212;
        auVar219._0_4_ = auVar38._0_4_ * fVar215;
        auVar219._4_4_ = auVar38._4_4_ * fVar210;
        auVar219._8_4_ = auVar38._8_4_ * fVar211;
        auVar219._12_4_ = auVar38._12_4_ * fVar212;
        auVar184._0_4_ = auVar39._0_4_ * fVar215;
        auVar184._4_4_ = auVar39._4_4_ * fVar210;
        auVar184._8_4_ = auVar39._8_4_ * fVar211;
        auVar184._12_4_ = auVar39._12_4_ * fVar212;
        auVar53 = vfmadd231ps_fma(auVar194,auVar235,auVar108);
        auVar54 = vfmadd231ps_fma(auVar202,auVar235,auVar161);
        auVar47 = vfmadd231ps_fma(auVar219,auVar235,auVar44);
        auVar48 = vfmadd231ps_fma(auVar184,(undefined1  [16])0x0,auVar235);
        auVar42 = vshufpd_avx(auVar53,auVar53,1);
        auVar43 = vshufpd_avx(auVar54,auVar54,1);
        auVar100._16_48_ = auVar99._16_48_;
        auVar59 = vshufpd_avx512vl(auVar47,auVar47,1);
        auVar60 = vshufpd_avx512vl(auVar48,auVar48,1);
        auVar38 = vminss_avx(auVar53,auVar54);
        auVar53 = vmaxss_avx(auVar54,auVar53);
        auVar39 = vminss_avx(auVar47,auVar48);
        auVar54 = vmaxss_avx(auVar48,auVar47);
        auVar38 = vminss_avx(auVar38,auVar39);
        auVar53 = vmaxss_avx(auVar54,auVar53);
        auVar39 = vminss_avx(auVar42,auVar43);
        auVar54 = vmaxss_avx(auVar43,auVar42);
        auVar42 = vminss_avx512f(auVar59,auVar60);
        auVar43 = vmaxss_avx512f(auVar60,auVar59);
        auVar54 = vmaxss_avx(auVar43,auVar54);
        auVar100._0_16_ = vminss_avx512f(auVar39,auVar42);
        fVar210 = auVar54._0_4_;
        fVar215 = auVar53._0_4_;
        if (auVar38._0_4_ < 0.0001) {
          bVar35 = fVar210 == -0.0001;
          bVar32 = NAN(fVar210);
          if (fVar210 <= -0.0001) goto LAB_01b580ea;
          break;
        }
LAB_01b580ea:
        vucomiss_avx512f(auVar100._0_16_);
        bVar35 = fVar210 <= -0.0001;
        bVar33 = -0.0001 < fVar215;
        bVar32 = bVar35;
        if (!bVar35) break;
        uVar15 = vcmpps_avx512vl(auVar38,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar16 = vcmpps_avx512vl(auVar100._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar22 = (byte)uVar15 & (byte)uVar16 & 1;
        bVar35 = bVar33 && bVar22 == 0;
        bVar32 = bVar33 && bVar22 == 0;
      } while (!bVar33 || bVar22 != 0);
      vcmpss_avx512f(auVar38,auVar50,1);
      auVar43 = auVar250._0_16_;
      uVar15 = vcmpss_avx512f(auVar53,auVar50,1);
      bVar33 = (bool)((byte)uVar15 & 1);
      auVar88._16_48_ = auVar100._16_48_;
      auVar88._0_16_ = auVar43;
      iVar101 = auVar250._0_4_;
      auVar87._4_60_ = auVar88._4_60_;
      auVar87._0_4_ = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * iVar101);
      vucomiss_avx512f(auVar87._0_16_);
      bVar32 = (bool)(!bVar35 | bVar32);
      bVar33 = bVar32 == false;
      auVar90._16_48_ = auVar100._16_48_;
      auVar90._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar89._4_60_ = auVar90._4_60_;
      auVar89._0_4_ = (uint)bVar32 * auVar107._0_4_ + (uint)!bVar32 * 0x7f800000;
      auVar42 = auVar89._0_16_;
      auVar92._16_48_ = auVar100._16_48_;
      auVar92._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar91._4_60_ = auVar92._4_60_;
      auVar91._0_4_ = (uint)bVar32 * auVar107._0_4_ + (uint)!bVar32 * -0x800000;
      auVar39 = auVar91._0_16_;
      uVar15 = vcmpss_avx512f(auVar100._0_16_,auVar50,1);
      bVar35 = (bool)((byte)uVar15 & 1);
      auVar94._16_48_ = auVar100._16_48_;
      auVar94._0_16_ = auVar43;
      auVar93._4_60_ = auVar94._4_60_;
      auVar93._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * iVar101);
      vucomiss_avx512f(auVar93._0_16_);
      if ((bVar32) || (bVar33)) {
        auVar47 = vucomiss_avx512f(auVar38);
        if ((bVar32) || (bVar33)) {
          auVar48 = vxorps_avx512vl(auVar38,auVar252._0_16_);
          auVar38 = vsubss_avx512f(auVar47,auVar38);
          auVar38 = vdivss_avx512f(auVar48,auVar38);
          auVar47 = vsubss_avx512f(auVar43,auVar38);
          auVar38 = vfmadd213ss_avx512f(auVar47,auVar50,auVar38);
          auVar47 = auVar38;
        }
        else {
          auVar47 = vxorps_avx512vl(auVar47,auVar47);
          vucomiss_avx512f(auVar47);
          if ((bVar32) || (auVar38 = auVar43, bVar33)) {
            auVar38 = SUB6416(ZEXT464(0xff800000),0);
            auVar47 = ZEXT416(0x7f800000);
          }
        }
        auVar42 = vminss_avx512f(auVar42,auVar47);
        auVar39 = vmaxss_avx(auVar38,auVar39);
      }
      uVar15 = vcmpss_avx512f(auVar54,auVar50,1);
      bVar35 = (bool)((byte)uVar15 & 1);
      fVar211 = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * iVar101);
      if ((auVar87._0_4_ != fVar211) || (NAN(auVar87._0_4_) || NAN(fVar211))) {
        if ((fVar210 != fVar215) || (NAN(fVar210) || NAN(fVar215))) {
          auVar53 = vxorps_avx512vl(auVar53,auVar252._0_16_);
          auVar185._0_4_ = auVar53._0_4_ / (fVar210 - fVar215);
          auVar185._4_12_ = auVar53._4_12_;
          auVar53 = vsubss_avx512f(auVar43,auVar185);
          auVar53 = vfmadd213ss_avx512f(auVar53,auVar50,auVar185);
          auVar54 = auVar53;
        }
        else if ((fVar215 != 0.0) ||
                (auVar53 = auVar43, auVar54 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar215))) {
          auVar53 = SUB6416(ZEXT464(0xff800000),0);
          auVar54 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar42 = vminss_avx(auVar42,auVar54);
        auVar39 = vmaxss_avx(auVar53,auVar39);
      }
      bVar35 = auVar93._0_4_ != fVar211;
      auVar53 = vminss_avx512f(auVar42,auVar43);
      auVar96._16_48_ = auVar100._16_48_;
      auVar96._0_16_ = auVar42;
      auVar95._4_60_ = auVar96._4_60_;
      auVar95._0_4_ = (uint)bVar35 * auVar53._0_4_ + (uint)!bVar35 * auVar42._0_4_;
      auVar53 = vmaxss_avx512f(auVar43,auVar39);
      auVar98._16_48_ = auVar100._16_48_;
      auVar98._0_16_ = auVar39;
      auVar97._4_60_ = auVar98._4_60_;
      auVar97._0_4_ = (uint)bVar35 * auVar53._0_4_ + (uint)!bVar35 * auVar39._0_4_;
      auVar53 = vmaxss_avx512f(auVar50,auVar95._0_16_);
      auVar100._0_16_ = vminss_avx512f(auVar97._0_16_,auVar43);
    } while (auVar100._0_4_ < auVar53._0_4_);
    auVar47 = vmaxss_avx512f(auVar50,ZEXT416((uint)(auVar53._0_4_ + -0.1)));
    auVar48 = vminss_avx512f(ZEXT416((uint)(auVar100._0_4_ + 0.1)),auVar43);
    auVar121._0_8_ = auVar108._0_8_;
    auVar121._8_8_ = auVar121._0_8_;
    auVar203._8_8_ = auVar161._0_8_;
    auVar203._0_8_ = auVar161._0_8_;
    auVar220._8_8_ = auVar44._0_8_;
    auVar220._0_8_ = auVar44._0_8_;
    auVar53 = vshufpd_avx(auVar161,auVar161,3);
    auVar54 = vshufpd_avx(auVar44,auVar44,3);
    auVar38 = vshufps_avx(auVar47,auVar48,0);
    auVar42 = vsubps_avx512vl(auVar51,auVar38);
    fVar215 = auVar38._0_4_;
    auVar155._0_4_ = fVar215 * auVar40._0_4_;
    fVar210 = auVar38._4_4_;
    auVar155._4_4_ = fVar210 * auVar40._4_4_;
    fVar211 = auVar38._8_4_;
    auVar155._8_4_ = fVar211 * auVar40._8_4_;
    fVar212 = auVar38._12_4_;
    auVar155._12_4_ = fVar212 * auVar40._12_4_;
    auVar162._0_4_ = fVar215 * auVar53._0_4_;
    auVar162._4_4_ = fVar210 * auVar53._4_4_;
    auVar162._8_4_ = fVar211 * auVar53._8_4_;
    auVar162._12_4_ = fVar212 * auVar53._12_4_;
    auVar241._0_4_ = auVar54._0_4_ * fVar215;
    auVar241._4_4_ = auVar54._4_4_ * fVar210;
    auVar241._8_4_ = auVar54._8_4_ * fVar211;
    auVar241._12_4_ = auVar54._12_4_ * fVar212;
    auVar142._0_4_ = fVar215 * auVar41._0_4_;
    auVar142._4_4_ = fVar210 * auVar41._4_4_;
    auVar142._8_4_ = fVar211 * auVar41._8_4_;
    auVar142._12_4_ = fVar212 * auVar41._12_4_;
    auVar39 = vfmadd231ps_fma(auVar155,auVar42,auVar121);
    auVar40 = vfmadd231ps_fma(auVar162,auVar42,auVar203);
    auVar41 = vfmadd231ps_fma(auVar241,auVar42,auVar220);
    auVar42 = vfmadd231ps_fma(auVar142,auVar42,ZEXT816(0));
    auVar54 = vsubss_avx512f(auVar43,auVar47);
    auVar53 = vmovshdup_avx(auVar55);
    auVar108 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * auVar47._0_4_)),auVar55,auVar54);
    auVar54 = vsubss_avx512f(auVar43,auVar48);
    auVar59 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * auVar48._0_4_)),auVar55,auVar54);
    auVar44 = vdivss_avx512f(auVar43,ZEXT416((uint)fVar200));
    auVar53 = vsubps_avx(auVar40,auVar39);
    auVar47 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar55 = vmulps_avx512vl(auVar53,auVar47);
    auVar53 = vsubps_avx(auVar41,auVar40);
    auVar38 = vmulps_avx512vl(auVar53,auVar47);
    auVar53 = vsubps_avx(auVar42,auVar41);
    auVar53 = vmulps_avx512vl(auVar53,auVar47);
    auVar54 = vminps_avx(auVar38,auVar53);
    auVar53 = vmaxps_avx(auVar38,auVar53);
    auVar54 = vminps_avx(auVar55,auVar54);
    auVar53 = vmaxps_avx(auVar55,auVar53);
    auVar55 = vshufpd_avx(auVar54,auVar54,3);
    auVar38 = vshufpd_avx(auVar53,auVar53,3);
    auVar54 = vminps_avx(auVar54,auVar55);
    auVar53 = vmaxps_avx(auVar53,auVar38);
    fVar200 = auVar44._0_4_;
    auVar186._0_4_ = auVar54._0_4_ * fVar200;
    auVar186._4_4_ = auVar54._4_4_ * fVar200;
    auVar186._8_4_ = auVar54._8_4_ * fVar200;
    auVar186._12_4_ = auVar54._12_4_ * fVar200;
    auVar174._0_4_ = fVar200 * auVar53._0_4_;
    auVar174._4_4_ = fVar200 * auVar53._4_4_;
    auVar174._8_4_ = fVar200 * auVar53._8_4_;
    auVar174._12_4_ = fVar200 * auVar53._12_4_;
    auVar44 = vdivss_avx512f(auVar43,ZEXT416((uint)(auVar59._0_4_ - auVar108._0_4_)));
    auVar53 = vshufpd_avx(auVar39,auVar39,3);
    auVar54 = vshufpd_avx(auVar40,auVar40,3);
    auVar55 = vshufpd_avx(auVar41,auVar41,3);
    auVar38 = vshufpd_avx(auVar42,auVar42,3);
    auVar53 = vsubps_avx(auVar53,auVar39);
    auVar39 = vsubps_avx(auVar54,auVar40);
    auVar40 = vsubps_avx(auVar55,auVar41);
    auVar38 = vsubps_avx(auVar38,auVar42);
    auVar54 = vminps_avx(auVar53,auVar39);
    auVar53 = vmaxps_avx(auVar53,auVar39);
    auVar55 = vminps_avx(auVar40,auVar38);
    auVar55 = vminps_avx(auVar54,auVar55);
    auVar54 = vmaxps_avx(auVar40,auVar38);
    auVar53 = vmaxps_avx(auVar53,auVar54);
    fVar200 = auVar44._0_4_;
    auVar221._0_4_ = fVar200 * auVar55._0_4_;
    auVar221._4_4_ = fVar200 * auVar55._4_4_;
    auVar221._8_4_ = fVar200 * auVar55._8_4_;
    auVar221._12_4_ = fVar200 * auVar55._12_4_;
    auVar204._0_4_ = fVar200 * auVar53._0_4_;
    auVar204._4_4_ = fVar200 * auVar53._4_4_;
    auVar204._8_4_ = fVar200 * auVar53._8_4_;
    auVar204._12_4_ = fVar200 * auVar53._12_4_;
    auVar38 = vinsertps_avx(auVar37,auVar108,0x10);
    auVar60 = vpermt2ps_avx512vl(auVar37,_DAT_01fb9f90,auVar59);
    auVar110._0_4_ = auVar38._0_4_ + auVar60._0_4_;
    auVar110._4_4_ = auVar38._4_4_ + auVar60._4_4_;
    auVar110._8_4_ = auVar38._8_4_ + auVar60._8_4_;
    auVar110._12_4_ = auVar38._12_4_ + auVar60._12_4_;
    auVar44 = vmulps_avx512vl(auVar110,auVar253._0_16_);
    auVar54 = vshufps_avx(auVar44,auVar44,0x54);
    uVar102 = auVar44._0_4_;
    auVar112._4_4_ = uVar102;
    auVar112._0_4_ = uVar102;
    auVar112._8_4_ = uVar102;
    auVar112._12_4_ = uVar102;
    auVar55 = vfmadd213ps_fma(local_470,auVar112,auVar46);
    auVar39 = vfmadd213ps_fma(local_480,auVar112,auVar45);
    auVar40 = vfmadd213ps_fma(local_490,auVar112,auVar52);
    auVar53 = vsubps_avx(auVar39,auVar55);
    auVar55 = vfmadd213ps_fma(auVar53,auVar112,auVar55);
    auVar53 = vsubps_avx(auVar40,auVar39);
    auVar53 = vfmadd213ps_fma(auVar53,auVar112,auVar39);
    auVar53 = vsubps_avx(auVar53,auVar55);
    auVar55 = vfmadd231ps_fma(auVar55,auVar53,auVar112);
    auVar41 = vmulps_avx512vl(auVar53,auVar47);
    auVar229._8_8_ = auVar55._0_8_;
    auVar229._0_8_ = auVar55._0_8_;
    auVar53 = vshufpd_avx(auVar55,auVar55,3);
    auVar55 = vshufps_avx(auVar44,auVar44,0x55);
    auVar39 = vsubps_avx(auVar53,auVar229);
    auVar40 = vfmadd231ps_fma(auVar229,auVar55,auVar39);
    auVar242._8_8_ = auVar41._0_8_;
    auVar242._0_8_ = auVar41._0_8_;
    auVar53 = vshufpd_avx(auVar41,auVar41,3);
    auVar53 = vsubps_avx512vl(auVar53,auVar242);
    auVar53 = vfmadd213ps_avx512vl(auVar53,auVar55,auVar242);
    auVar113._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
    auVar113._8_4_ = auVar39._8_4_ ^ 0x80000000;
    auVar113._12_4_ = auVar39._12_4_ ^ 0x80000000;
    auVar55 = vmovshdup_avx512vl(auVar53);
    auVar243._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
    auVar243._8_4_ = auVar55._8_4_ ^ 0x80000000;
    auVar243._12_4_ = auVar55._12_4_ ^ 0x80000000;
    auVar41 = vmovshdup_avx512vl(auVar39);
    auVar42 = vpermt2ps_avx512vl(auVar243,ZEXT416(5),auVar39);
    auVar55 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar55._0_4_ * auVar39._0_4_)),auVar53,auVar41);
    auVar39 = vpermt2ps_avx512vl(auVar53,SUB6416(ZEXT464(4),0),auVar113);
    auVar143._0_4_ = auVar55._0_4_;
    auVar143._4_4_ = auVar143._0_4_;
    auVar143._8_4_ = auVar143._0_4_;
    auVar143._12_4_ = auVar143._0_4_;
    auVar53 = vdivps_avx(auVar42,auVar143);
    auVar61 = vdivps_avx512vl(auVar39,auVar143);
    fVar200 = auVar40._0_4_;
    auVar55 = vshufps_avx(auVar40,auVar40,0x55);
    auVar230._0_4_ = fVar200 * auVar53._0_4_ + auVar55._0_4_ * auVar61._0_4_;
    auVar230._4_4_ = fVar200 * auVar53._4_4_ + auVar55._4_4_ * auVar61._4_4_;
    auVar230._8_4_ = fVar200 * auVar53._8_4_ + auVar55._8_4_ * auVar61._8_4_;
    auVar230._12_4_ = fVar200 * auVar53._12_4_ + auVar55._12_4_ * auVar61._12_4_;
    auVar47 = vsubps_avx(auVar54,auVar230);
    auVar55 = vmovshdup_avx(auVar53);
    auVar54 = vinsertps_avx(auVar186,auVar221,0x1c);
    auVar244._0_4_ = auVar55._0_4_ * auVar54._0_4_;
    auVar244._4_4_ = auVar55._4_4_ * auVar54._4_4_;
    auVar244._8_4_ = auVar55._8_4_ * auVar54._8_4_;
    auVar244._12_4_ = auVar55._12_4_ * auVar54._12_4_;
    auVar48 = vinsertps_avx512f(auVar174,auVar204,0x1c);
    auVar55 = vmulps_avx512vl(auVar55,auVar48);
    auVar42 = vminps_avx512vl(auVar244,auVar55);
    auVar40 = vmaxps_avx(auVar55,auVar244);
    auVar41 = vmovshdup_avx(auVar61);
    auVar55 = vinsertps_avx(auVar221,auVar186,0x4c);
    auVar222._0_4_ = auVar41._0_4_ * auVar55._0_4_;
    auVar222._4_4_ = auVar41._4_4_ * auVar55._4_4_;
    auVar222._8_4_ = auVar41._8_4_ * auVar55._8_4_;
    auVar222._12_4_ = auVar41._12_4_ * auVar55._12_4_;
    auVar39 = vinsertps_avx(auVar204,auVar174,0x4c);
    auVar205._0_4_ = auVar41._0_4_ * auVar39._0_4_;
    auVar205._4_4_ = auVar41._4_4_ * auVar39._4_4_;
    auVar205._8_4_ = auVar41._8_4_ * auVar39._8_4_;
    auVar205._12_4_ = auVar41._12_4_ * auVar39._12_4_;
    auVar41 = vminps_avx(auVar222,auVar205);
    auVar42 = vaddps_avx512vl(auVar42,auVar41);
    auVar41 = vmaxps_avx(auVar205,auVar222);
    auVar206._0_4_ = auVar40._0_4_ + auVar41._0_4_;
    auVar206._4_4_ = auVar40._4_4_ + auVar41._4_4_;
    auVar206._8_4_ = auVar40._8_4_ + auVar41._8_4_;
    auVar206._12_4_ = auVar40._12_4_ + auVar41._12_4_;
    auVar223._8_8_ = 0x3f80000000000000;
    auVar223._0_8_ = 0x3f80000000000000;
    auVar40 = vsubps_avx(auVar223,auVar206);
    auVar41 = vsubps_avx(auVar223,auVar42);
    auVar42 = vsubps_avx(auVar38,auVar44);
    auVar44 = vsubps_avx(auVar60,auVar44);
    fVar212 = auVar42._0_4_;
    auVar245._0_4_ = fVar212 * auVar40._0_4_;
    fVar213 = auVar42._4_4_;
    auVar245._4_4_ = fVar213 * auVar40._4_4_;
    fVar214 = auVar42._8_4_;
    auVar245._8_4_ = fVar214 * auVar40._8_4_;
    fVar167 = auVar42._12_4_;
    auVar245._12_4_ = fVar167 * auVar40._12_4_;
    auVar62 = vbroadcastss_avx512vl(auVar53);
    auVar54 = vmulps_avx512vl(auVar62,auVar54);
    auVar48 = vmulps_avx512vl(auVar62,auVar48);
    auVar62 = vminps_avx512vl(auVar54,auVar48);
    auVar48 = vmaxps_avx512vl(auVar48,auVar54);
    auVar54 = vbroadcastss_avx512vl(auVar61);
    auVar55 = vmulps_avx512vl(auVar54,auVar55);
    auVar54 = vmulps_avx512vl(auVar54,auVar39);
    auVar39 = vminps_avx512vl(auVar55,auVar54);
    auVar39 = vaddps_avx512vl(auVar62,auVar39);
    auVar42 = vmulps_avx512vl(auVar42,auVar41);
    fVar200 = auVar44._0_4_;
    auVar207._0_4_ = fVar200 * auVar40._0_4_;
    fVar215 = auVar44._4_4_;
    auVar207._4_4_ = fVar215 * auVar40._4_4_;
    fVar210 = auVar44._8_4_;
    auVar207._8_4_ = fVar210 * auVar40._8_4_;
    fVar211 = auVar44._12_4_;
    auVar207._12_4_ = fVar211 * auVar40._12_4_;
    auVar224._0_4_ = fVar200 * auVar41._0_4_;
    auVar224._4_4_ = fVar215 * auVar41._4_4_;
    auVar224._8_4_ = fVar210 * auVar41._8_4_;
    auVar224._12_4_ = fVar211 * auVar41._12_4_;
    auVar54 = vmaxps_avx(auVar54,auVar55);
    auVar175._0_4_ = auVar48._0_4_ + auVar54._0_4_;
    auVar175._4_4_ = auVar48._4_4_ + auVar54._4_4_;
    auVar175._8_4_ = auVar48._8_4_ + auVar54._8_4_;
    auVar175._12_4_ = auVar48._12_4_ + auVar54._12_4_;
    auVar187._8_8_ = 0x3f800000;
    auVar187._0_8_ = 0x3f800000;
    auVar54 = vsubps_avx(auVar187,auVar175);
    auVar55 = vsubps_avx512vl(auVar187,auVar39);
    auVar236._0_4_ = fVar212 * auVar54._0_4_;
    auVar236._4_4_ = fVar213 * auVar54._4_4_;
    auVar236._8_4_ = fVar214 * auVar54._8_4_;
    auVar236._12_4_ = fVar167 * auVar54._12_4_;
    auVar231._0_4_ = fVar212 * auVar55._0_4_;
    auVar231._4_4_ = fVar213 * auVar55._4_4_;
    auVar231._8_4_ = fVar214 * auVar55._8_4_;
    auVar231._12_4_ = fVar167 * auVar55._12_4_;
    auVar176._0_4_ = fVar200 * auVar54._0_4_;
    auVar176._4_4_ = fVar215 * auVar54._4_4_;
    auVar176._8_4_ = fVar210 * auVar54._8_4_;
    auVar176._12_4_ = fVar211 * auVar54._12_4_;
    auVar188._0_4_ = fVar200 * auVar55._0_4_;
    auVar188._4_4_ = fVar215 * auVar55._4_4_;
    auVar188._8_4_ = fVar210 * auVar55._8_4_;
    auVar188._12_4_ = fVar211 * auVar55._12_4_;
    auVar54 = vminps_avx(auVar236,auVar231);
    auVar55 = vminps_avx512vl(auVar176,auVar188);
    auVar39 = vminps_avx512vl(auVar54,auVar55);
    auVar54 = vmaxps_avx(auVar231,auVar236);
    auVar55 = vmaxps_avx(auVar188,auVar176);
    auVar55 = vmaxps_avx(auVar55,auVar54);
    auVar40 = vminps_avx512vl(auVar245,auVar42);
    auVar54 = vminps_avx(auVar207,auVar224);
    auVar54 = vminps_avx(auVar40,auVar54);
    auVar54 = vhaddps_avx(auVar39,auVar54);
    auVar100._0_16_ = vmaxps_avx512vl(auVar42,auVar245);
    auVar39 = vmaxps_avx(auVar224,auVar207);
    auVar39 = vmaxps_avx(auVar39,auVar100._0_16_);
    auVar55 = vhaddps_avx(auVar55,auVar39);
    auVar54 = vshufps_avx(auVar54,auVar54,0xe8);
    auVar55 = vshufps_avx(auVar55,auVar55,0xe8);
    auVar177._0_4_ = auVar54._0_4_ + auVar47._0_4_;
    auVar177._4_4_ = auVar54._4_4_ + auVar47._4_4_;
    auVar177._8_4_ = auVar54._8_4_ + auVar47._8_4_;
    auVar177._12_4_ = auVar54._12_4_ + auVar47._12_4_;
    auVar189._0_4_ = auVar55._0_4_ + auVar47._0_4_;
    auVar189._4_4_ = auVar55._4_4_ + auVar47._4_4_;
    auVar189._8_4_ = auVar55._8_4_ + auVar47._8_4_;
    auVar189._12_4_ = auVar55._12_4_ + auVar47._12_4_;
    auVar54 = vmaxps_avx(auVar38,auVar177);
    auVar55 = vminps_avx(auVar189,auVar60);
    uVar4 = vcmpps_avx512vl(auVar55,auVar54,1);
  } while ((uVar4 & 3) != 0);
  uVar4 = vcmpps_avx512vl(auVar189,auVar60,1);
  uVar15 = vcmpps_avx512vl(auVar37,auVar177,1);
  if (((ushort)uVar15 & (ushort)uVar4 & 1) == 0) {
    bVar22 = 0;
  }
  else {
    auVar54 = vmovshdup_avx(auVar177);
    bVar22 = auVar108._0_4_ < auVar54._0_4_ & (byte)(uVar4 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar24 || uVar8 != 0 && !bVar34) | bVar22) != 1) goto LAB_01b58d58;
  lVar27 = 0xc9;
  do {
    lVar27 = lVar27 + -1;
    if (lVar27 == 0) goto LAB_01b57eb9;
    auVar37 = vsubss_avx512f(auVar43,auVar47);
    fVar210 = auVar37._0_4_;
    fVar200 = fVar210 * fVar210 * fVar210;
    auVar37 = vmulss_avx512f(auVar47,ZEXT416(0x40400000));
    fVar215 = auVar37._0_4_ * fVar210 * fVar210;
    fVar211 = auVar47._0_4_;
    auVar37 = vmulss_avx512f(ZEXT416((uint)(fVar211 * fVar211)),ZEXT416(0x40400000));
    fVar210 = fVar210 * auVar37._0_4_;
    auVar131._4_4_ = fVar200;
    auVar131._0_4_ = fVar200;
    auVar131._8_4_ = fVar200;
    auVar131._12_4_ = fVar200;
    auVar122._4_4_ = fVar215;
    auVar122._0_4_ = fVar215;
    auVar122._8_4_ = fVar215;
    auVar122._12_4_ = fVar215;
    auVar104._4_4_ = fVar210;
    auVar104._0_4_ = fVar210;
    auVar104._8_4_ = fVar210;
    auVar104._12_4_ = fVar210;
    fVar211 = fVar211 * fVar211 * fVar211;
    auVar156._0_4_ = (float)local_4a0._0_4_ * fVar211;
    auVar156._4_4_ = (float)local_4a0._4_4_ * fVar211;
    auVar156._8_4_ = fStack_498 * fVar211;
    auVar156._12_4_ = fStack_494 * fVar211;
    auVar37 = vfmadd231ps_fma(auVar156,auVar52,auVar104);
    auVar37 = vfmadd231ps_fma(auVar37,auVar45,auVar122);
    auVar37 = vfmadd231ps_fma(auVar37,auVar46,auVar131);
    auVar105._8_8_ = auVar37._0_8_;
    auVar105._0_8_ = auVar37._0_8_;
    auVar37 = vshufpd_avx(auVar37,auVar37,3);
    auVar54 = vshufps_avx(auVar47,auVar47,0x55);
    auVar37 = vsubps_avx(auVar37,auVar105);
    auVar54 = vfmadd213ps_fma(auVar37,auVar54,auVar105);
    fVar200 = auVar54._0_4_;
    auVar37 = vshufps_avx(auVar54,auVar54,0x55);
    auVar106._0_4_ = auVar53._0_4_ * fVar200 + auVar61._0_4_ * auVar37._0_4_;
    auVar106._4_4_ = auVar53._4_4_ * fVar200 + auVar61._4_4_ * auVar37._4_4_;
    auVar106._8_4_ = auVar53._8_4_ * fVar200 + auVar61._8_4_ * auVar37._8_4_;
    auVar106._12_4_ = auVar53._12_4_ * fVar200 + auVar61._12_4_ * auVar37._12_4_;
    auVar47 = vsubps_avx(auVar47,auVar106);
    auVar37 = vandps_avx512vl(auVar54,auVar251._0_16_);
    auVar100._0_16_ = vprolq_avx512vl(auVar37,0x20);
    auVar37 = vmaxss_avx(auVar100._0_16_,auVar37);
    bVar34 = (float)local_4b0._0_4_ < auVar37._0_4_;
  } while ((float)local_4b0._0_4_ <= auVar37._0_4_);
  auVar37 = vucomiss_avx512f(auVar50);
  if (bVar34) goto LAB_01b57eb9;
  auVar53 = vucomiss_avx512f(auVar37);
  auVar250 = ZEXT1664(auVar53);
  if (bVar34) goto LAB_01b57eb9;
  vmovshdup_avx(auVar37);
  auVar53 = vucomiss_avx512f(auVar50);
  if (bVar34) goto LAB_01b57eb9;
  auVar54 = vucomiss_avx512f(auVar53);
  auVar250 = ZEXT1664(auVar54);
  if (bVar34) goto LAB_01b57eb9;
  auVar55 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar44 = vinsertps_avx(auVar55,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar55 = vdpps_avx(auVar44,local_4c0,0x7f);
  auVar38 = vdpps_avx(auVar44,local_4d0,0x7f);
  auVar39 = vdpps_avx(auVar44,local_4e0,0x7f);
  auVar40 = vdpps_avx(auVar44,local_4f0,0x7f);
  auVar41 = vdpps_avx(auVar44,local_500,0x7f);
  auVar42 = vdpps_avx(auVar44,local_510,0x7f);
  auVar43 = vdpps_avx(auVar44,local_520,0x7f);
  auVar44 = vdpps_avx(auVar44,local_530,0x7f);
  auVar47 = vsubss_avx512f(auVar54,auVar53);
  fVar200 = auVar53._0_4_;
  auVar53 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar41._0_4_)),auVar47,auVar55);
  auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * fVar200)),auVar47,auVar38);
  auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * fVar200)),auVar47,auVar39);
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar44._0_4_)),auVar47,auVar40);
  auVar54 = vsubss_avx512f(auVar54,auVar37);
  auVar157._0_4_ = auVar54._0_4_;
  fVar215 = auVar157._0_4_ * auVar157._0_4_ * auVar157._0_4_;
  auVar54 = vmulss_avx512f(auVar37,ZEXT416(0x40400000));
  fVar210 = auVar54._0_4_ * auVar157._0_4_ * auVar157._0_4_;
  fVar200 = auVar37._0_4_;
  auVar144._0_4_ = fVar200 * fVar200;
  auVar144._4_4_ = auVar37._4_4_ * auVar37._4_4_;
  auVar144._8_4_ = auVar37._8_4_ * auVar37._8_4_;
  auVar144._12_4_ = auVar37._12_4_ * auVar37._12_4_;
  auVar100._0_16_ = vmulss_avx512f(auVar144,ZEXT416(0x40400000));
  fVar211 = auVar157._0_4_ * auVar100._0_4_;
  fVar212 = fVar200 * auVar144._0_4_;
  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * auVar39._0_4_)),ZEXT416((uint)fVar211),auVar38)
  ;
  auVar54 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar210),auVar55);
  vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar215),auVar53);
  auVar53 = vucomiss_avx512f(ZEXT416(uVar3));
  if (bVar34) goto LAB_01b57eb9;
  fVar213 = *(float *)(ray + k * 4 + 0x200);
  if (fVar213 < auVar53._0_4_) goto LAB_01b57eb9;
  auVar54 = vshufps_avx(auVar37,auVar37,0x55);
  auVar38 = vsubps_avx512vl(auVar51,auVar54);
  fVar214 = auVar54._0_4_;
  auVar190._0_4_ = fVar214 * (float)local_580._0_4_;
  fVar167 = auVar54._4_4_;
  auVar190._4_4_ = fVar167 * (float)local_580._4_4_;
  fVar168 = auVar54._8_4_;
  auVar190._8_4_ = fVar168 * fStack_578;
  fVar169 = auVar54._12_4_;
  auVar190._12_4_ = fVar169 * fStack_574;
  auVar195._0_4_ = fVar214 * (float)local_590._0_4_;
  auVar195._4_4_ = fVar167 * (float)local_590._4_4_;
  auVar195._8_4_ = fVar168 * fStack_588;
  auVar195._12_4_ = fVar169 * fStack_584;
  auVar208._0_4_ = fVar214 * (float)local_5a0._0_4_;
  auVar208._4_4_ = fVar167 * (float)local_5a0._4_4_;
  auVar208._8_4_ = fVar168 * fStack_598;
  auVar208._12_4_ = fVar169 * fStack_594;
  auVar163._0_4_ = fVar214 * (float)local_5b0._0_4_;
  auVar163._4_4_ = fVar167 * (float)local_5b0._4_4_;
  auVar163._8_4_ = fVar168 * fStack_5a8;
  auVar163._12_4_ = fVar169 * fStack_5a4;
  auVar51 = vfmadd231ps_fma(auVar190,auVar38,local_540);
  auVar54 = vfmadd231ps_fma(auVar195,auVar38,local_550);
  auVar55 = vfmadd231ps_fma(auVar208,auVar38,local_560);
  auVar38 = vfmadd231ps_fma(auVar163,auVar38,local_570);
  auVar51 = vsubps_avx(auVar54,auVar51);
  auVar54 = vsubps_avx(auVar55,auVar54);
  auVar55 = vsubps_avx(auVar38,auVar55);
  auVar209._0_4_ = fVar200 * auVar54._0_4_;
  auVar209._4_4_ = fVar200 * auVar54._4_4_;
  auVar209._8_4_ = fVar200 * auVar54._8_4_;
  auVar209._12_4_ = fVar200 * auVar54._12_4_;
  auVar157._4_4_ = auVar157._0_4_;
  auVar157._8_4_ = auVar157._0_4_;
  auVar157._12_4_ = auVar157._0_4_;
  auVar51 = vfmadd231ps_fma(auVar209,auVar157,auVar51);
  auVar164._0_4_ = fVar200 * auVar55._0_4_;
  auVar164._4_4_ = fVar200 * auVar55._4_4_;
  auVar164._8_4_ = fVar200 * auVar55._8_4_;
  auVar164._12_4_ = fVar200 * auVar55._12_4_;
  auVar54 = vfmadd231ps_fma(auVar164,auVar157,auVar54);
  auVar165._0_4_ = fVar200 * auVar54._0_4_;
  auVar165._4_4_ = fVar200 * auVar54._4_4_;
  auVar165._8_4_ = fVar200 * auVar54._8_4_;
  auVar165._12_4_ = fVar200 * auVar54._12_4_;
  auVar51 = vfmadd231ps_fma(auVar165,auVar157,auVar51);
  auVar19._8_4_ = 0x40400000;
  auVar19._0_8_ = 0x4040000040400000;
  auVar19._12_4_ = 0x40400000;
  auVar100._0_16_ = vmulps_avx512vl(auVar51,auVar19);
  pGVar9 = (context->scene->geometries).items[uVar7].ptr;
  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar22 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01b58d50;
    auVar145._0_4_ = fVar212 * (float)local_5f0._0_4_;
    auVar145._4_4_ = fVar212 * (float)local_5f0._4_4_;
    auVar145._8_4_ = fVar212 * fStack_5e8;
    auVar145._12_4_ = fVar212 * fStack_5e4;
    auVar132._4_4_ = fVar211;
    auVar132._0_4_ = fVar211;
    auVar132._8_4_ = fVar211;
    auVar132._12_4_ = fVar211;
    auVar51 = vfmadd132ps_fma(auVar132,auVar145,local_5e0);
    auVar123._4_4_ = fVar210;
    auVar123._0_4_ = fVar210;
    auVar123._8_4_ = fVar210;
    auVar123._12_4_ = fVar210;
    auVar51 = vfmadd132ps_fma(auVar123,auVar51,local_5d0);
    auVar114._4_4_ = fVar215;
    auVar114._0_4_ = fVar215;
    auVar114._8_4_ = fVar215;
    auVar114._12_4_ = fVar215;
    auVar55 = vfmadd132ps_fma(auVar114,auVar51,local_5c0);
    auVar51 = vshufps_avx(auVar55,auVar55,0xc9);
    auVar54 = vshufps_avx(auVar100._0_16_,auVar100._0_16_,0xc9);
    auVar115._0_4_ = auVar55._0_4_ * auVar54._0_4_;
    auVar115._4_4_ = auVar55._4_4_ * auVar54._4_4_;
    auVar115._8_4_ = auVar55._8_4_ * auVar54._8_4_;
    auVar115._12_4_ = auVar55._12_4_ * auVar54._12_4_;
    auVar51 = vfmsub231ps_fma(auVar115,auVar100._0_16_,auVar51);
    local_200 = vbroadcastss_avx512f(auVar37);
    auVar99 = vbroadcastss_avx512f(ZEXT416(1));
    local_1c0 = vpermps_avx512f(auVar99,ZEXT1664(auVar37));
    auVar99 = vpermps_avx512f(auVar99,ZEXT1664(auVar51));
    auVar100 = vbroadcastss_avx512f(ZEXT416(2));
    local_280 = vpermps_avx512f(auVar100,ZEXT1664(auVar51));
    local_240 = vbroadcastss_avx512f(auVar51);
    local_2c0[0] = (RTCHitN)auVar99[0];
    local_2c0[1] = (RTCHitN)auVar99[1];
    local_2c0[2] = (RTCHitN)auVar99[2];
    local_2c0[3] = (RTCHitN)auVar99[3];
    local_2c0[4] = (RTCHitN)auVar99[4];
    local_2c0[5] = (RTCHitN)auVar99[5];
    local_2c0[6] = (RTCHitN)auVar99[6];
    local_2c0[7] = (RTCHitN)auVar99[7];
    local_2c0[8] = (RTCHitN)auVar99[8];
    local_2c0[9] = (RTCHitN)auVar99[9];
    local_2c0[10] = (RTCHitN)auVar99[10];
    local_2c0[0xb] = (RTCHitN)auVar99[0xb];
    local_2c0[0xc] = (RTCHitN)auVar99[0xc];
    local_2c0[0xd] = (RTCHitN)auVar99[0xd];
    local_2c0[0xe] = (RTCHitN)auVar99[0xe];
    local_2c0[0xf] = (RTCHitN)auVar99[0xf];
    local_2c0[0x10] = (RTCHitN)auVar99[0x10];
    local_2c0[0x11] = (RTCHitN)auVar99[0x11];
    local_2c0[0x12] = (RTCHitN)auVar99[0x12];
    local_2c0[0x13] = (RTCHitN)auVar99[0x13];
    local_2c0[0x14] = (RTCHitN)auVar99[0x14];
    local_2c0[0x15] = (RTCHitN)auVar99[0x15];
    local_2c0[0x16] = (RTCHitN)auVar99[0x16];
    local_2c0[0x17] = (RTCHitN)auVar99[0x17];
    local_2c0[0x18] = (RTCHitN)auVar99[0x18];
    local_2c0[0x19] = (RTCHitN)auVar99[0x19];
    local_2c0[0x1a] = (RTCHitN)auVar99[0x1a];
    local_2c0[0x1b] = (RTCHitN)auVar99[0x1b];
    local_2c0[0x1c] = (RTCHitN)auVar99[0x1c];
    local_2c0[0x1d] = (RTCHitN)auVar99[0x1d];
    local_2c0[0x1e] = (RTCHitN)auVar99[0x1e];
    local_2c0[0x1f] = (RTCHitN)auVar99[0x1f];
    local_2c0[0x20] = (RTCHitN)auVar99[0x20];
    local_2c0[0x21] = (RTCHitN)auVar99[0x21];
    local_2c0[0x22] = (RTCHitN)auVar99[0x22];
    local_2c0[0x23] = (RTCHitN)auVar99[0x23];
    local_2c0[0x24] = (RTCHitN)auVar99[0x24];
    local_2c0[0x25] = (RTCHitN)auVar99[0x25];
    local_2c0[0x26] = (RTCHitN)auVar99[0x26];
    local_2c0[0x27] = (RTCHitN)auVar99[0x27];
    local_2c0[0x28] = (RTCHitN)auVar99[0x28];
    local_2c0[0x29] = (RTCHitN)auVar99[0x29];
    local_2c0[0x2a] = (RTCHitN)auVar99[0x2a];
    local_2c0[0x2b] = (RTCHitN)auVar99[0x2b];
    local_2c0[0x2c] = (RTCHitN)auVar99[0x2c];
    local_2c0[0x2d] = (RTCHitN)auVar99[0x2d];
    local_2c0[0x2e] = (RTCHitN)auVar99[0x2e];
    local_2c0[0x2f] = (RTCHitN)auVar99[0x2f];
    local_2c0[0x30] = (RTCHitN)auVar99[0x30];
    local_2c0[0x31] = (RTCHitN)auVar99[0x31];
    local_2c0[0x32] = (RTCHitN)auVar99[0x32];
    local_2c0[0x33] = (RTCHitN)auVar99[0x33];
    local_2c0[0x34] = (RTCHitN)auVar99[0x34];
    local_2c0[0x35] = (RTCHitN)auVar99[0x35];
    local_2c0[0x36] = (RTCHitN)auVar99[0x36];
    local_2c0[0x37] = (RTCHitN)auVar99[0x37];
    local_2c0[0x38] = (RTCHitN)auVar99[0x38];
    local_2c0[0x39] = (RTCHitN)auVar99[0x39];
    local_2c0[0x3a] = (RTCHitN)auVar99[0x3a];
    local_2c0[0x3b] = (RTCHitN)auVar99[0x3b];
    local_2c0[0x3c] = (RTCHitN)auVar99[0x3c];
    local_2c0[0x3d] = (RTCHitN)auVar99[0x3d];
    local_2c0[0x3e] = (RTCHitN)auVar99[0x3e];
    local_2c0[0x3f] = (RTCHitN)auVar99[0x3f];
    local_180 = local_300._0_8_;
    uStack_178 = local_300._8_8_;
    uStack_170 = local_300._16_8_;
    uStack_168 = local_300._24_8_;
    uStack_160 = local_300._32_8_;
    uStack_158 = local_300._40_8_;
    uStack_150 = local_300._48_8_;
    uStack_148 = local_300._56_8_;
    auVar99 = vmovdqa64_avx512f(local_340);
    local_140 = vmovdqa64_avx512f(auVar99);
    vpcmpeqd_avx2(auVar99._0_32_,auVar99._0_32_);
    local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
    local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
    *(float *)(ray + k * 4 + 0x200) = auVar53._0_4_;
    auVar100 = vmovdqa64_avx512f(local_380);
    local_400 = vmovdqa64_avx512f(auVar100);
    local_620.valid = (int *)local_400;
    local_620.geometryUserPtr = pGVar9->userPtr;
    local_620.context = context->user;
    local_620.ray = (RTCRayN *)ray;
    local_620.hit = local_2c0;
    local_620.N = 0x10;
    if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar9->occlusionFilterN)(&local_620);
      auVar249 = ZEXT3264(_DAT_01fb9fe0);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar248 = ZEXT1664(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar247 = ZEXT1664(auVar37);
      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar246 = ZEXT3264(auVar79);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar252 = ZEXT1664(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar251 = ZEXT1664(auVar37);
      auVar250 = ZEXT464(0x3f800000);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar253 = ZEXT1664(auVar37);
      auVar37 = vxorps_avx512vl(auVar50,auVar50);
      auVar107 = ZEXT1664(auVar37);
      auVar100 = vmovdqa64_avx512f(local_400);
    }
    auVar37 = auVar107._0_16_;
    uVar15 = vptestmd_avx512f(auVar100,auVar100);
    if ((short)uVar15 != 0) {
      p_Var14 = context->args->filter;
      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var14)(&local_620);
        auVar249 = ZEXT3264(_DAT_01fb9fe0);
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar248 = ZEXT1664(auVar50);
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar247 = ZEXT1664(auVar50);
        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar246 = ZEXT3264(auVar79);
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar252 = ZEXT1664(auVar50);
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar251 = ZEXT1664(auVar50);
        auVar250 = ZEXT464(0x3f800000);
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar253 = ZEXT1664(auVar50);
        auVar37 = vxorps_avx512vl(auVar37,auVar37);
        auVar107 = ZEXT1664(auVar37);
        auVar100 = vmovdqa64_avx512f(local_400);
      }
      uVar4 = vptestmd_avx512f(auVar100,auVar100);
      auVar99 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar34 = (bool)((byte)uVar4 & 1);
      auVar100._0_4_ =
           (uint)bVar34 * auVar99._0_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x200);
      bVar34 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar100._4_4_ =
           (uint)bVar34 * auVar99._4_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x204);
      bVar34 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar100._8_4_ =
           (uint)bVar34 * auVar99._8_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x208);
      bVar34 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar100._12_4_ =
           (uint)bVar34 * auVar99._12_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x20c);
      bVar34 = (bool)((byte)(uVar4 >> 4) & 1);
      auVar100._16_4_ =
           (uint)bVar34 * auVar99._16_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x210);
      bVar34 = (bool)((byte)(uVar4 >> 5) & 1);
      auVar100._20_4_ =
           (uint)bVar34 * auVar99._20_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x214);
      bVar34 = (bool)((byte)(uVar4 >> 6) & 1);
      auVar100._24_4_ =
           (uint)bVar34 * auVar99._24_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x218);
      bVar34 = (bool)((byte)(uVar4 >> 7) & 1);
      auVar100._28_4_ =
           (uint)bVar34 * auVar99._28_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x21c);
      bVar34 = (bool)((byte)(uVar4 >> 8) & 1);
      auVar100._32_4_ =
           (uint)bVar34 * auVar99._32_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x220);
      bVar34 = (bool)((byte)(uVar4 >> 9) & 1);
      auVar100._36_4_ =
           (uint)bVar34 * auVar99._36_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x224);
      bVar34 = (bool)((byte)(uVar4 >> 10) & 1);
      auVar100._40_4_ =
           (uint)bVar34 * auVar99._40_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x228);
      bVar34 = (bool)((byte)(uVar4 >> 0xb) & 1);
      auVar100._44_4_ =
           (uint)bVar34 * auVar99._44_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x22c);
      bVar34 = (bool)((byte)(uVar4 >> 0xc) & 1);
      auVar100._48_4_ =
           (uint)bVar34 * auVar99._48_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x230);
      bVar34 = (bool)((byte)(uVar4 >> 0xd) & 1);
      auVar100._52_4_ =
           (uint)bVar34 * auVar99._52_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x234);
      bVar34 = (bool)((byte)(uVar4 >> 0xe) & 1);
      auVar100._56_4_ =
           (uint)bVar34 * auVar99._56_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x238);
      bVar34 = SUB81(uVar4 >> 0xf,0);
      auVar100._60_4_ =
           (uint)bVar34 * auVar99._60_4_ | (uint)!bVar34 * *(int *)(local_620.ray + 0x23c);
      *(undefined1 (*) [64])(local_620.ray + 0x200) = auVar100;
      bVar22 = 1;
      if ((short)uVar4 != 0) goto LAB_01b58d50;
    }
    *(float *)(ray + k * 4 + 0x200) = fVar213;
  }
  bVar22 = 0;
LAB_01b58d50:
  bVar31 = (bool)(bVar31 | bVar22);
  goto LAB_01b57eb9;
LAB_01b58d58:
  auVar55 = vinsertps_avx(auVar108,auVar59,0x10);
LAB_01b58d5e:
  auVar79 = vbroadcastss_avx512vl(ZEXT416(3));
  goto LAB_01b579c9;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }